

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O2

void embree::avx512::CurveNiMBIntersector1<8>::
     intersect_n<embree::avx512::OrientedCurve1Intersector1<embree::BezierCurveT,7,8>,embree::avx512::Intersect1Epilog1<true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  long lVar1;
  ulong uVar2;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  uint uVar6;
  uint uVar7;
  Geometry *pGVar8;
  __int_type_conflict _Var9;
  long lVar10;
  long lVar11;
  long lVar12;
  RTCFilterFunctionN p_Var13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  byte bVar26;
  uint uVar27;
  ulong uVar28;
  long lVar30;
  uint uVar31;
  long lVar32;
  ulong uVar33;
  long lVar34;
  ulong uVar35;
  bool bVar36;
  bool bVar37;
  bool bVar38;
  bool bVar39;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar85 [32];
  undefined1 auVar61 [16];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar62 [16];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar96 [32];
  undefined1 auVar98 [32];
  undefined1 auVar100 [32];
  undefined1 auVar102 [32];
  int iVar104;
  undefined4 uVar105;
  vfloat4 a0_3;
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  vfloat4 a0_1;
  undefined1 auVar110 [16];
  vfloat4 a0_2;
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  vfloat4 a0;
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  vfloat4 b0;
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [32];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  __m128 a;
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [32];
  float fVar149;
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [32];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [32];
  float fVar166;
  float fVar179;
  float fVar180;
  float fVar181;
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [32];
  vfloat4 a0_4;
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  float fVar191;
  float fVar202;
  float fVar203;
  vfloat4 b0_1;
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  float fVar204;
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  float fVar205;
  float fVar206;
  float fVar207;
  __m128 a_3;
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  vfloat4 a0_5;
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [64];
  undefined1 auVar234 [64];
  undefined1 auVar235 [64];
  undefined1 auVar236 [64];
  undefined1 auVar237 [64];
  undefined1 auVar238 [64];
  undefined1 auVar239 [64];
  undefined1 auVar240 [64];
  undefined1 auVar241 [64];
  undefined1 auVar242 [64];
  undefined1 auVar243 [64];
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  vfloat_impl<4> p00;
  RTCFilterFunctionNArguments args;
  uint mask_stack [4];
  vfloat_impl<4> p03;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  int local_32c;
  undefined1 local_328 [16];
  ulong local_310;
  undefined1 local_308 [8];
  float fStack_300;
  float fStack_2fc;
  undefined1 local_2f8 [8];
  float fStack_2f0;
  float fStack_2ec;
  undefined1 local_2e8 [8];
  float fStack_2e0;
  float fStack_2dc;
  undefined1 local_2d8 [8];
  float fStack_2d0;
  float fStack_2cc;
  undefined1 local_2c8 [16];
  undefined1 local_2b8 [16];
  undefined1 local_2a8 [16];
  undefined1 local_298 [16];
  undefined1 local_288 [16];
  undefined1 local_278 [16];
  undefined1 local_268 [16];
  long local_258;
  Primitive *local_250;
  RTCFilterFunctionNArguments local_248;
  undefined1 local_218 [8];
  float fStack_210;
  float fStack_20c;
  undefined1 local_208 [8];
  float fStack_200;
  float fStack_1fc;
  undefined1 local_1f8 [8];
  float fStack_1f0;
  float fStack_1ec;
  undefined1 local_1e8 [8];
  float fStack_1e0;
  float fStack_1dc;
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [16];
  uint auStack_198 [4];
  undefined8 local_188;
  float local_180;
  undefined8 local_17c;
  uint local_174;
  uint local_170;
  uint local_16c;
  uint local_168;
  undefined1 local_158 [8];
  float fStack_150;
  float fStack_14c;
  undefined1 local_148 [16];
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  undefined1 local_108 [8];
  float fStack_100;
  float fStack_fc;
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [32];
  undefined1 local_b8 [32];
  undefined8 uStack_98;
  undefined1 local_78 [32];
  ulong auStack_58 [5];
  ulong uVar29;
  undefined1 auVar86 [32];
  undefined1 auVar95 [32];
  undefined1 auVar97 [32];
  undefined1 auVar99 [32];
  undefined1 auVar101 [32];
  undefined1 auVar103 [32];
  undefined1 auVar225 [32];
  
  uVar28 = (ulong)(byte)prim[1];
  lVar34 = uVar28 * 0x25;
  auVar40._8_8_ = 0;
  auVar40._0_8_ = *(ulong *)(prim + uVar28 * 4 + 6);
  auVar83 = vpmovsxbd_avx2(auVar40);
  auVar41._8_8_ = 0;
  auVar41._0_8_ = *(ulong *)(prim + uVar28 * 5 + 6);
  auVar80 = vpmovsxbd_avx2(auVar41);
  auVar49._8_8_ = 0;
  auVar49._0_8_ = *(ulong *)(prim + uVar28 * 6 + 6);
  auVar81 = vpmovsxbd_avx2(auVar49);
  auVar48._8_8_ = 0;
  auVar48._0_8_ = *(ulong *)(prim + uVar28 * 0xf + 6);
  auVar87 = vpmovsxbd_avx2(auVar48);
  auVar55._8_8_ = 0;
  auVar55._0_8_ = *(ulong *)(prim + (ulong)(byte)prim[1] * 0x10 + 6);
  auVar84 = vpmovsxbd_avx2(auVar55);
  auVar52._8_8_ = 0;
  auVar52._0_8_ = *(ulong *)(prim + uVar28 * 0x11 + 6);
  auVar82 = vpmovsxbd_avx2(auVar52);
  auVar53._8_8_ = 0;
  auVar53._0_8_ = *(ulong *)(prim + uVar28 * 0x1a + 6);
  auVar79 = vpmovsxbd_avx2(auVar53);
  auVar54._8_8_ = 0;
  auVar54._0_8_ = *(ulong *)(prim + uVar28 * 0x1b + 6);
  auVar73 = vpmovsxbd_avx2(auVar54);
  auVar40 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(prim + lVar34 + 0x12)));
  auVar41 = vsubps_avx512vl((undefined1  [16])(ray->super_RayK<1>).org.field_0,
                            *(undefined1 (*) [16])(prim + lVar34 + 6));
  auVar58._8_8_ = 0;
  auVar58._0_8_ = *(ulong *)(prim + uVar28 * 0x1c + 6);
  auVar74 = vpmovsxbd_avx2(auVar58);
  fVar207 = ((ray->super_RayK<1>).dir.field_0.m128[3] - *(float *)(prim + lVar34 + 0x16)) *
            *(float *)(prim + lVar34 + 0x1a);
  auVar88 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar28 * 7 + 6));
  auVar65 = vpbroadcastd_avx512vl();
  auVar66 = vpmovsxwd_avx512vl(*(undefined1 (*) [16])(prim + uVar28 * 0xb + 6));
  auVar67 = vpmovsxwd_avx512vl(*(undefined1 (*) [16])(prim + uVar28 * 9 + 6));
  auVar68 = vpmovsxwd_avx512vl(*(undefined1 (*) [16])(prim + uVar28 * 0xd + 6));
  auVar89 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar28 * 0x12 + 6));
  auVar90 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar28 * 0x16 + 6));
  auVar91 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar28 * 0x14 + 6));
  auVar92 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar28 * 0x18 + 6));
  auVar41 = vmulps_avx512vl(auVar40,auVar41);
  auVar40 = vmulps_avx512vl(auVar40,(undefined1  [16])(ray->super_RayK<1>).dir.field_0);
  auVar69 = vcvtdq2ps_avx512vl(auVar83);
  auVar70 = vcvtdq2ps_avx512vl(auVar80);
  auVar71 = vcvtdq2ps_avx512vl(auVar81);
  auVar72 = vcvtdq2ps_avx512vl(auVar87);
  auVar83 = vcvtdq2ps_avx(auVar84);
  auVar81 = vcvtdq2ps_avx(auVar82);
  auVar87 = vcvtdq2ps_avx(auVar79);
  auVar84 = vcvtdq2ps_avx(auVar73);
  auVar82 = vcvtdq2ps_avx(auVar74);
  auVar73 = vbroadcastss_avx512vl(auVar40);
  auVar74 = vbroadcastss_avx512vl(ZEXT416(1));
  auVar75 = vpermps_avx512vl(auVar74,ZEXT1632(auVar40));
  auVar76 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar77 = vpermps_avx512vl(auVar76,ZEXT1632(auVar40));
  auVar78 = vmulps_avx512vl(auVar77,auVar71);
  auVar79._4_4_ = auVar77._4_4_ * auVar81._4_4_;
  auVar79._0_4_ = auVar77._0_4_ * auVar81._0_4_;
  auVar79._8_4_ = auVar77._8_4_ * auVar81._8_4_;
  auVar79._12_4_ = auVar77._12_4_ * auVar81._12_4_;
  auVar79._16_4_ = auVar77._16_4_ * auVar81._16_4_;
  auVar79._20_4_ = auVar77._20_4_ * auVar81._20_4_;
  auVar79._24_4_ = auVar77._24_4_ * auVar81._24_4_;
  auVar79._28_4_ = auVar80._28_4_;
  auVar80._4_4_ = auVar82._4_4_ * auVar77._4_4_;
  auVar80._0_4_ = auVar82._0_4_ * auVar77._0_4_;
  auVar80._8_4_ = auVar82._8_4_ * auVar77._8_4_;
  auVar80._12_4_ = auVar82._12_4_ * auVar77._12_4_;
  auVar80._16_4_ = auVar82._16_4_ * auVar77._16_4_;
  auVar80._20_4_ = auVar82._20_4_ * auVar77._20_4_;
  auVar80._24_4_ = auVar82._24_4_ * auVar77._24_4_;
  auVar80._28_4_ = auVar77._28_4_;
  auVar77 = vfmadd231ps_avx512vl(auVar78,auVar75,auVar70);
  auVar79 = vfmadd231ps_avx512vl(auVar79,auVar75,auVar83);
  auVar80 = vfmadd231ps_avx512vl(auVar80,auVar84,auVar75);
  auVar75 = vfmadd231ps_avx512vl(auVar77,auVar73,auVar69);
  auVar79 = vfmadd231ps_avx512vl(auVar79,auVar73,auVar72);
  auVar40 = vfmadd231ps_fma(auVar80,auVar87,auVar73);
  auVar80 = vbroadcastss_avx512vl(auVar41);
  auVar73 = vpermps_avx512vl(auVar74,ZEXT1632(auVar41));
  auVar74 = vpermps_avx512vl(auVar76,ZEXT1632(auVar41));
  auVar71 = vmulps_avx512vl(auVar74,auVar71);
  auVar81 = vmulps_avx512vl(auVar74,auVar81);
  auVar82 = vmulps_avx512vl(auVar74,auVar82);
  auVar74 = vfmadd231ps_avx512vl(auVar71,auVar73,auVar70);
  auVar83 = vfmadd231ps_avx512vl(auVar81,auVar73,auVar83);
  auVar81 = vfmadd231ps_avx512vl(auVar82,auVar73,auVar84);
  auVar84 = vfmadd231ps_avx512vl(auVar74,auVar80,auVar69);
  auVar238 = ZEXT3264(auVar84);
  auVar82 = vfmadd231ps_avx512vl(auVar83,auVar80,auVar72);
  auVar71._16_16_ = vfmadd231ps_fma(auVar81,auVar80,auVar87);
  auVar76._8_4_ = 0x7fffffff;
  auVar76._0_8_ = 0x7fffffff7fffffff;
  auVar76._12_4_ = 0x7fffffff;
  auVar76._16_4_ = 0x7fffffff;
  auVar76._20_4_ = 0x7fffffff;
  auVar76._24_4_ = 0x7fffffff;
  auVar76._28_4_ = 0x7fffffff;
  auVar83 = vandps_avx(auVar75,auVar76);
  auVar77._8_4_ = 0x219392ef;
  auVar77._0_8_ = 0x219392ef219392ef;
  auVar77._12_4_ = 0x219392ef;
  auVar77._16_4_ = 0x219392ef;
  auVar77._20_4_ = 0x219392ef;
  auVar77._24_4_ = 0x219392ef;
  auVar77._28_4_ = 0x219392ef;
  uVar35 = vcmpps_avx512vl(auVar83,auVar77,1);
  bVar38 = (bool)((byte)uVar35 & 1);
  auVar69._0_4_ = (uint)bVar38 * 0x219392ef | (uint)!bVar38 * auVar75._0_4_;
  bVar38 = (bool)((byte)(uVar35 >> 1) & 1);
  auVar69._4_4_ = (uint)bVar38 * 0x219392ef | (uint)!bVar38 * auVar75._4_4_;
  bVar38 = (bool)((byte)(uVar35 >> 2) & 1);
  auVar69._8_4_ = (uint)bVar38 * 0x219392ef | (uint)!bVar38 * auVar75._8_4_;
  bVar38 = (bool)((byte)(uVar35 >> 3) & 1);
  auVar69._12_4_ = (uint)bVar38 * 0x219392ef | (uint)!bVar38 * auVar75._12_4_;
  bVar38 = (bool)((byte)(uVar35 >> 4) & 1);
  auVar69._16_4_ = (uint)bVar38 * 0x219392ef | (uint)!bVar38 * auVar75._16_4_;
  bVar38 = (bool)((byte)(uVar35 >> 5) & 1);
  auVar69._20_4_ = (uint)bVar38 * 0x219392ef | (uint)!bVar38 * auVar75._20_4_;
  bVar38 = (bool)((byte)(uVar35 >> 6) & 1);
  auVar69._24_4_ = (uint)bVar38 * 0x219392ef | (uint)!bVar38 * auVar75._24_4_;
  bVar38 = SUB81(uVar35 >> 7,0);
  auVar69._28_4_ = (uint)bVar38 * 0x219392ef | (uint)!bVar38 * auVar75._28_4_;
  auVar83 = vandps_avx(auVar79,auVar76);
  uVar35 = vcmpps_avx512vl(auVar83,auVar77,1);
  bVar38 = (bool)((byte)uVar35 & 1);
  auVar70._0_4_ = (uint)bVar38 * 0x219392ef | (uint)!bVar38 * auVar79._0_4_;
  bVar38 = (bool)((byte)(uVar35 >> 1) & 1);
  auVar70._4_4_ = (uint)bVar38 * 0x219392ef | (uint)!bVar38 * auVar79._4_4_;
  bVar38 = (bool)((byte)(uVar35 >> 2) & 1);
  auVar70._8_4_ = (uint)bVar38 * 0x219392ef | (uint)!bVar38 * auVar79._8_4_;
  bVar38 = (bool)((byte)(uVar35 >> 3) & 1);
  auVar70._12_4_ = (uint)bVar38 * 0x219392ef | (uint)!bVar38 * auVar79._12_4_;
  bVar38 = (bool)((byte)(uVar35 >> 4) & 1);
  auVar70._16_4_ = (uint)bVar38 * 0x219392ef | (uint)!bVar38 * auVar79._16_4_;
  bVar38 = (bool)((byte)(uVar35 >> 5) & 1);
  auVar70._20_4_ = (uint)bVar38 * 0x219392ef | (uint)!bVar38 * auVar79._20_4_;
  bVar38 = (bool)((byte)(uVar35 >> 6) & 1);
  auVar70._24_4_ = (uint)bVar38 * 0x219392ef | (uint)!bVar38 * auVar79._24_4_;
  bVar38 = SUB81(uVar35 >> 7,0);
  auVar70._28_4_ = (uint)bVar38 * 0x219392ef | (uint)!bVar38 * auVar79._28_4_;
  auVar83 = vandps_avx(ZEXT1632(auVar40),auVar76);
  uVar35 = vcmpps_avx512vl(auVar83,auVar77,1);
  bVar38 = (bool)((byte)uVar35 & 1);
  auVar83._0_4_ = (uint)bVar38 * 0x219392ef | (uint)!bVar38 * auVar40._0_4_;
  bVar38 = (bool)((byte)(uVar35 >> 1) & 1);
  auVar83._4_4_ = (uint)bVar38 * 0x219392ef | (uint)!bVar38 * auVar40._4_4_;
  bVar38 = (bool)((byte)(uVar35 >> 2) & 1);
  auVar83._8_4_ = (uint)bVar38 * 0x219392ef | (uint)!bVar38 * auVar40._8_4_;
  bVar38 = (bool)((byte)(uVar35 >> 3) & 1);
  auVar83._12_4_ = (uint)bVar38 * 0x219392ef | (uint)!bVar38 * auVar40._12_4_;
  auVar83._16_4_ = (uint)((byte)(uVar35 >> 4) & 1) * 0x219392ef;
  auVar83._20_4_ = (uint)((byte)(uVar35 >> 5) & 1) * 0x219392ef;
  auVar83._24_4_ = (uint)((byte)(uVar35 >> 6) & 1) * 0x219392ef;
  auVar83._28_4_ = (uint)(byte)(uVar35 >> 7) * 0x219392ef;
  auVar75._8_4_ = 0x3f800000;
  auVar75._0_8_ = 0x3f8000003f800000;
  auVar75._12_4_ = 0x3f800000;
  auVar75._16_4_ = 0x3f800000;
  auVar75._20_4_ = 0x3f800000;
  auVar75._24_4_ = 0x3f800000;
  auVar75._28_4_ = 0x3f800000;
  auVar81 = vrcp14ps_avx512vl(auVar69);
  auVar40 = vfnmadd213ps_fma(auVar69,auVar81,auVar75);
  auVar40 = vfmadd132ps_fma(ZEXT1632(auVar40),auVar81,auVar81);
  auVar81 = vrcp14ps_avx512vl(auVar70);
  auVar41 = vfnmadd213ps_fma(auVar70,auVar81,auVar75);
  auVar41 = vfmadd132ps_fma(ZEXT1632(auVar41),auVar81,auVar81);
  auVar81 = vrcp14ps_avx512vl(auVar83);
  auVar49 = vfnmadd213ps_fma(auVar83,auVar81,auVar75);
  auVar49 = vfmadd132ps_fma(ZEXT1632(auVar49),auVar81,auVar81);
  auVar72._4_4_ = fVar207;
  auVar72._0_4_ = fVar207;
  auVar72._8_4_ = fVar207;
  auVar72._12_4_ = fVar207;
  auVar72._16_4_ = fVar207;
  auVar72._20_4_ = fVar207;
  auVar72._24_4_ = fVar207;
  auVar72._28_4_ = fVar207;
  auVar83 = vcvtdq2ps_avx(auVar88);
  auVar81 = vcvtdq2ps_avx512vl(auVar66);
  auVar81 = vsubps_avx(auVar81,auVar83);
  auVar48 = vfmadd213ps_fma(auVar81,auVar72,auVar83);
  auVar81 = vcvtdq2ps_avx512vl(auVar67);
  auVar83 = vcvtdq2ps_avx512vl(auVar68);
  auVar83 = vsubps_avx(auVar83,auVar81);
  auVar55 = vfmadd213ps_fma(auVar83,auVar72,auVar81);
  auVar83 = vcvtdq2ps_avx(auVar89);
  auVar81 = vcvtdq2ps_avx(auVar90);
  auVar81 = vsubps_avx(auVar81,auVar83);
  auVar52 = vfmadd213ps_fma(auVar81,auVar72,auVar83);
  auVar83 = vcvtdq2ps_avx(auVar91);
  auVar81 = vcvtdq2ps_avx(auVar92);
  auVar81 = vsubps_avx(auVar81,auVar83);
  auVar53 = vfmadd213ps_fma(auVar81,auVar72,auVar83);
  auVar83 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar28 * 0x1d + 6));
  auVar81 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar28 * 0x21 + 6));
  auVar83 = vcvtdq2ps_avx(auVar83);
  auVar81 = vcvtdq2ps_avx(auVar81);
  auVar81 = vsubps_avx(auVar81,auVar83);
  auVar54 = vfmadd213ps_fma(auVar81,auVar72,auVar83);
  auVar83 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar28 * 0x1f + 6));
  auVar83 = vcvtdq2ps_avx(auVar83);
  local_250 = prim;
  auVar81 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar28 * 0x23 + 6));
  auVar81 = vcvtdq2ps_avx(auVar81);
  auVar81 = vsubps_avx(auVar81,auVar83);
  auVar58 = vfmadd213ps_fma(auVar81,auVar72,auVar83);
  auVar83 = vsubps_avx512vl(ZEXT1632(auVar48),auVar84);
  auVar73._4_4_ = auVar40._4_4_ * auVar83._4_4_;
  auVar73._0_4_ = auVar40._0_4_ * auVar83._0_4_;
  auVar73._8_4_ = auVar40._8_4_ * auVar83._8_4_;
  auVar73._12_4_ = auVar40._12_4_ * auVar83._12_4_;
  auVar73._16_4_ = auVar83._16_4_ * 0.0;
  auVar73._20_4_ = auVar83._20_4_ * 0.0;
  auVar73._24_4_ = auVar83._24_4_ * 0.0;
  auVar73._28_4_ = auVar83._28_4_;
  auVar83 = vsubps_avx512vl(ZEXT1632(auVar55),auVar84);
  auVar91._0_4_ = auVar40._0_4_ * auVar83._0_4_;
  auVar91._4_4_ = auVar40._4_4_ * auVar83._4_4_;
  auVar91._8_4_ = auVar40._8_4_ * auVar83._8_4_;
  auVar91._12_4_ = auVar40._12_4_ * auVar83._12_4_;
  auVar91._16_4_ = auVar83._16_4_ * 0.0;
  auVar91._20_4_ = auVar83._20_4_ * 0.0;
  auVar91._24_4_ = auVar83._24_4_ * 0.0;
  auVar91._28_4_ = 0;
  auVar83 = vsubps_avx512vl(ZEXT1632(auVar52),auVar82);
  auVar74._4_4_ = auVar41._4_4_ * auVar83._4_4_;
  auVar74._0_4_ = auVar41._0_4_ * auVar83._0_4_;
  auVar74._8_4_ = auVar41._8_4_ * auVar83._8_4_;
  auVar74._12_4_ = auVar41._12_4_ * auVar83._12_4_;
  auVar74._16_4_ = auVar83._16_4_ * 0.0;
  auVar74._20_4_ = auVar83._20_4_ * 0.0;
  auVar74._24_4_ = auVar83._24_4_ * 0.0;
  auVar74._28_4_ = auVar83._28_4_;
  auVar83 = vsubps_avx512vl(ZEXT1632(auVar53),auVar82);
  auVar90._0_4_ = auVar41._0_4_ * auVar83._0_4_;
  auVar90._4_4_ = auVar41._4_4_ * auVar83._4_4_;
  auVar90._8_4_ = auVar41._8_4_ * auVar83._8_4_;
  auVar90._12_4_ = auVar41._12_4_ * auVar83._12_4_;
  auVar90._16_4_ = auVar83._16_4_ * 0.0;
  auVar90._20_4_ = auVar83._20_4_ * 0.0;
  auVar90._24_4_ = auVar83._24_4_ * 0.0;
  auVar90._28_4_ = 0;
  auVar83 = vsubps_avx(ZEXT1632(auVar54),ZEXT1632(auVar71._16_16_));
  auVar88._4_4_ = auVar49._4_4_ * auVar83._4_4_;
  auVar88._0_4_ = auVar49._0_4_ * auVar83._0_4_;
  auVar88._8_4_ = auVar49._8_4_ * auVar83._8_4_;
  auVar88._12_4_ = auVar49._12_4_ * auVar83._12_4_;
  auVar88._16_4_ = auVar83._16_4_ * 0.0;
  auVar88._20_4_ = auVar83._20_4_ * 0.0;
  auVar88._24_4_ = auVar83._24_4_ * 0.0;
  auVar88._28_4_ = auVar83._28_4_;
  auVar83 = vsubps_avx(ZEXT1632(auVar58),ZEXT1632(auVar71._16_16_));
  auVar89._0_4_ = auVar49._0_4_ * auVar83._0_4_;
  auVar89._4_4_ = auVar49._4_4_ * auVar83._4_4_;
  auVar89._8_4_ = auVar49._8_4_ * auVar83._8_4_;
  auVar89._12_4_ = auVar49._12_4_ * auVar83._12_4_;
  auVar89._16_4_ = auVar83._16_4_ * 0.0;
  auVar89._20_4_ = auVar83._20_4_ * 0.0;
  auVar89._24_4_ = auVar83._24_4_ * 0.0;
  auVar89._28_4_ = 0;
  auVar83 = vpminsd_avx2(auVar73,auVar91);
  auVar81 = vpminsd_avx2(auVar74,auVar90);
  auVar83 = vmaxps_avx(auVar83,auVar81);
  auVar81 = vpminsd_avx2(auVar88,auVar89);
  uVar105 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar87._4_4_ = uVar105;
  auVar87._0_4_ = uVar105;
  auVar87._8_4_ = uVar105;
  auVar87._12_4_ = uVar105;
  auVar87._16_4_ = uVar105;
  auVar87._20_4_ = uVar105;
  auVar87._24_4_ = uVar105;
  auVar87._28_4_ = uVar105;
  auVar81 = vmaxps_avx512vl(auVar81,auVar87);
  auVar83 = vmaxps_avx(auVar83,auVar81);
  auVar81._8_4_ = 0x3f7ffffa;
  auVar81._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar81._12_4_ = 0x3f7ffffa;
  auVar81._16_4_ = 0x3f7ffffa;
  auVar81._20_4_ = 0x3f7ffffa;
  auVar81._24_4_ = 0x3f7ffffa;
  auVar81._28_4_ = 0x3f7ffffa;
  local_78 = vmulps_avx512vl(auVar83,auVar81);
  auVar83 = vpmaxsd_avx2(auVar73,auVar91);
  auVar81 = vpmaxsd_avx2(auVar74,auVar90);
  auVar83 = vminps_avx(auVar83,auVar81);
  auVar81 = vpmaxsd_avx2(auVar88,auVar89);
  fVar207 = (ray->super_RayK<1>).tfar;
  auVar84._4_4_ = fVar207;
  auVar84._0_4_ = fVar207;
  auVar84._8_4_ = fVar207;
  auVar84._12_4_ = fVar207;
  auVar84._16_4_ = fVar207;
  auVar84._20_4_ = fVar207;
  auVar84._24_4_ = fVar207;
  auVar84._28_4_ = fVar207;
  auVar81 = vminps_avx512vl(auVar81,auVar84);
  auVar83 = vminps_avx(auVar83,auVar81);
  auVar82._8_4_ = 0x3f800003;
  auVar82._0_8_ = 0x3f8000033f800003;
  auVar82._12_4_ = 0x3f800003;
  auVar82._16_4_ = 0x3f800003;
  auVar82._20_4_ = 0x3f800003;
  auVar82._24_4_ = 0x3f800003;
  auVar82._28_4_ = 0x3f800003;
  auVar83 = vmulps_avx512vl(auVar83,auVar82);
  uVar14 = vcmpps_avx512vl(local_78,auVar83,2);
  uVar15 = vpcmpgtd_avx512vl(auVar65,_DAT_01fb4ba0);
  uVar35 = (ulong)(byte)((byte)uVar14 & (byte)uVar15);
  auVar71._16_16_ = auVar83._16_16_;
  auVar40 = vpxord_avx512vl(auVar66._0_16_,auVar66._0_16_);
  auVar233 = ZEXT1664(auVar40);
  auVar40 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
  auVar239 = ZEXT1664(auVar40);
  auVar40 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
  auVar234 = ZEXT1664(auVar40);
LAB_01b0e3c6:
  if (uVar35 == 0) {
    return;
  }
  lVar34 = 0;
  for (uVar28 = uVar35; (uVar28 & 1) == 0; uVar28 = uVar28 >> 1 | 0x8000000000000000) {
    lVar34 = lVar34 + 1;
  }
  uVar6 = *(uint *)(local_250 + 2);
  pGVar8 = (context->scene->geometries).items[uVar6].ptr;
  fVar207 = (pGVar8->time_range).lower;
  fVar207 = pGVar8->fnumTimeSegments *
            (((ray->super_RayK<1>).dir.field_0.m128[3] - fVar207) /
            ((pGVar8->time_range).upper - fVar207));
  auVar40 = vroundss_avx(ZEXT416((uint)fVar207),ZEXT416((uint)fVar207),9);
  auVar41 = vaddss_avx512f(ZEXT416((uint)pGVar8->fnumTimeSegments),SUB6416(ZEXT464(0xbf800000),0));
  auVar40 = vminss_avx(auVar40,auVar41);
  auVar42 = vmaxss_avx512f(auVar233._0_16_,auVar40);
  local_310 = (ulong)*(uint *)(local_250 + lVar34 * 4 + 6);
  uVar28 = (ulong)*(uint *)(*(long *)&pGVar8->field_0x58 +
                           (ulong)*(uint *)(local_250 + lVar34 * 4 + 6) *
                           pGVar8[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  _Var9 = pGVar8[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar32 = (long)(int)auVar42._0_4_ * 0x38;
  lVar10 = *(long *)(_Var9 + lVar32);
  lVar11 = *(long *)(_Var9 + 0x10 + lVar32);
  auVar40 = *(undefined1 (*) [16])(lVar10 + lVar11 * uVar28);
  lVar34 = uVar28 + 1;
  auVar41 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar34);
  lVar30 = uVar28 + 2;
  auVar49 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar30);
  lVar1 = uVar28 + 3;
  auVar48 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar1);
  lVar10 = *(long *)&pGVar8[4].fnumTimeSegments;
  lVar11 = *(long *)(lVar10 + lVar32);
  lVar12 = *(long *)(lVar10 + 0x10 + lVar32);
  auVar55 = *(undefined1 (*) [16])(lVar11 + lVar12 * uVar28);
  auVar52 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar34);
  auVar53 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar30);
  auVar54 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar1);
  lVar11 = *(long *)(_Var9 + 0x38 + lVar32);
  lVar12 = *(long *)(_Var9 + 0x48 + lVar32);
  auVar58 = *(undefined1 (*) [16])(lVar11 + lVar12 * uVar28);
  auVar59 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar34);
  auVar60 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar30);
  auVar61 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar1);
  lVar11 = *(long *)(lVar10 + 0x38 + lVar32);
  lVar10 = *(long *)(lVar10 + 0x48 + lVar32);
  auVar62 = *(undefined1 (*) [16])(lVar11 + uVar28 * lVar10);
  auVar63 = *(undefined1 (*) [16])(lVar11 + lVar34 * lVar10);
  auVar64 = *(undefined1 (*) [16])(lVar11 + lVar30 * lVar10);
  auVar42 = vsubss_avx512f(ZEXT416((uint)fVar207),auVar42);
  auVar65._0_16_ = vxorps_avx512vl(auVar238._0_16_,auVar238._0_16_);
  auVar43 = vmulps_avx512vl(auVar48,auVar65._0_16_);
  auVar43 = vfmadd231ps_avx512vl(auVar43,auVar49,auVar65._0_16_);
  auVar44 = vfmadd213ps_avx512vl(ZEXT816(0) << 0x20,auVar41,auVar43);
  auVar44 = vaddps_avx512vl(auVar40,auVar44);
  auVar141 = auVar239._0_16_;
  auVar43 = vfmadd231ps_avx512vl(auVar43,auVar41,auVar141);
  auVar43 = vfnmadd231ps_avx512vl(auVar43,auVar40,auVar141);
  auVar45 = vmulps_avx512vl(auVar54,auVar65._0_16_);
  auVar45 = vfmadd231ps_avx512vl(auVar45,auVar53,auVar65._0_16_);
  auVar111 = auVar234._0_16_;
  auVar46 = vxorps_avx512vl(auVar111,auVar111);
  auVar46 = vfmadd213ps_avx512vl(auVar46,auVar52,auVar45);
  auVar47 = vaddps_avx512vl(auVar55,auVar46);
  auVar45 = vfmadd231ps_avx512vl(auVar45,auVar52,auVar141);
  auVar45 = vfnmadd231ps_avx512vl(auVar45,auVar55,auVar141);
  auVar46 = vxorps_avx512vl(auVar46,auVar46);
  auVar46 = vfmadd213ps_avx512vl(auVar46,auVar49,auVar48);
  auVar46 = vfmadd231ps_avx512vl(auVar46,auVar41,auVar65._0_16_);
  auVar46 = vfmadd231ps_avx512vl(auVar46,auVar40,auVar65._0_16_);
  auVar48 = vmulps_avx512vl(auVar48,auVar141);
  auVar49 = vfnmadd231ps_avx512vl(auVar48,auVar141,auVar49);
  auVar41 = vfmadd231ps_avx512vl(auVar49,auVar65._0_16_,auVar41);
  auVar50 = vfnmadd231ps_avx512vl(auVar41,auVar65._0_16_,auVar40);
  auVar40 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar53,auVar54);
  auVar40 = vfmadd231ps_avx512vl(auVar40,auVar52,auVar65._0_16_);
  auVar51 = vfmadd231ps_avx512vl(auVar40,auVar55,auVar65._0_16_);
  auVar40 = vmulps_avx512vl(auVar54,auVar141);
  auVar40 = vfnmadd231ps_avx512vl(auVar40,auVar141,auVar53);
  auVar40 = vfmadd231ps_avx512vl(auVar40,auVar65._0_16_,auVar52);
  auVar52 = vfnmadd231ps_avx512vl(auVar40,auVar65._0_16_,auVar55);
  auVar41 = vshufps_avx512vl(auVar43,auVar43,0xc9);
  auVar40 = vshufps_avx512vl(auVar47,auVar47,0xc9);
  auVar40 = vmulps_avx512vl(auVar43,auVar40);
  auVar40 = vfmsub231ps_avx512vl(auVar40,auVar41,auVar47);
  auVar49 = vshufps_avx(auVar40,auVar40,0xc9);
  auVar40 = vshufps_avx(auVar45,auVar45,0xc9);
  auVar40 = vmulps_avx512vl(auVar43,auVar40);
  auVar40 = vfmsub231ps_fma(auVar40,auVar41,auVar45);
  auVar48 = vshufps_avx(auVar40,auVar40,0xc9);
  auVar40 = vshufps_avx(auVar50,auVar50,0xc9);
  auVar41 = vshufps_avx(auVar51,auVar51,0xc9);
  fVar204 = auVar50._0_4_;
  auVar137._0_4_ = fVar204 * auVar41._0_4_;
  fVar205 = auVar50._4_4_;
  auVar137._4_4_ = fVar205 * auVar41._4_4_;
  fVar206 = auVar50._8_4_;
  auVar137._8_4_ = fVar206 * auVar41._8_4_;
  fVar149 = auVar50._12_4_;
  auVar137._12_4_ = fVar149 * auVar41._12_4_;
  auVar41 = vfmsub231ps_fma(auVar137,auVar40,auVar51);
  auVar55 = vshufps_avx(auVar41,auVar41,0xc9);
  auVar41 = vshufps_avx(auVar52,auVar52,0xc9);
  auVar138._0_4_ = fVar204 * auVar41._0_4_;
  auVar138._4_4_ = fVar205 * auVar41._4_4_;
  auVar138._8_4_ = fVar206 * auVar41._8_4_;
  auVar138._12_4_ = fVar149 * auVar41._12_4_;
  auVar41 = vfmsub231ps_fma(auVar138,auVar40,auVar52);
  auVar40 = vdpps_avx(auVar49,auVar49,0x7f);
  auVar52 = vshufps_avx(auVar41,auVar41,0xc9);
  auVar65._16_16_ = auVar71._16_16_;
  auVar92._4_28_ = auVar65._4_28_;
  auVar92._0_4_ = auVar40._0_4_;
  auVar41 = vrsqrt14ss_avx512f(auVar65._0_16_,auVar92._0_16_);
  auVar53 = vmulss_avx512f(auVar41,ZEXT416(0x3fc00000));
  auVar54 = vmulss_avx512f(auVar40,ZEXT416(0x3f000000));
  auVar54 = vmulss_avx512f(auVar54,auVar41);
  auVar54 = vmulss_avx512f(auVar54,ZEXT416((uint)(auVar41._0_4_ * auVar41._0_4_)));
  auVar41 = vdpps_avx(auVar49,auVar48,0x7f);
  fVar202 = auVar53._0_4_ - auVar54._0_4_;
  fVar166 = fVar202 * auVar49._0_4_;
  fVar179 = fVar202 * auVar49._4_4_;
  fVar180 = fVar202 * auVar49._8_4_;
  fVar181 = fVar202 * auVar49._12_4_;
  auVar53 = vbroadcastss_avx512vl(auVar40);
  auVar48 = vmulps_avx512vl(auVar53,auVar48);
  fVar207 = auVar41._0_4_;
  auVar45._0_4_ = fVar207 * auVar49._0_4_;
  auVar45._4_4_ = fVar207 * auVar49._4_4_;
  auVar45._8_4_ = fVar207 * auVar49._8_4_;
  auVar45._12_4_ = fVar207 * auVar49._12_4_;
  auVar49 = vsubps_avx(auVar48,auVar45);
  auVar41 = vrcp14ss_avx512f(auVar65._0_16_,auVar92._0_16_);
  auVar40 = vfnmadd213ss_avx512f(auVar40,auVar41,ZEXT416(0x40000000));
  fVar207 = auVar41._0_4_ * auVar40._0_4_;
  auVar40 = vdpps_avx(auVar55,auVar55,0x7f);
  auVar67._16_16_ = auVar71._16_16_;
  auVar67._0_16_ = auVar65._0_16_;
  auVar66._4_28_ = auVar67._4_28_;
  auVar66._0_4_ = auVar40._0_4_;
  auVar41 = vrsqrt14ss_avx512f(auVar65._0_16_,auVar66._0_16_);
  auVar48 = vmulss_avx512f(auVar41,ZEXT416(0x3fc00000));
  auVar53 = vmulss_avx512f(auVar40,ZEXT416(0x3f000000));
  fVar191 = auVar41._0_4_;
  fVar203 = auVar48._0_4_ - auVar53._0_4_ * fVar191 * fVar191 * fVar191;
  auVar41 = vdpps_avx(auVar55,auVar52,0x7f);
  auVar158._0_4_ = auVar55._0_4_ * fVar203;
  auVar158._4_4_ = auVar55._4_4_ * fVar203;
  auVar158._8_4_ = auVar55._8_4_ * fVar203;
  auVar158._12_4_ = auVar55._12_4_ * fVar203;
  auVar48 = vbroadcastss_avx512vl(auVar40);
  auVar48 = vmulps_avx512vl(auVar48,auVar52);
  fVar191 = auVar41._0_4_;
  auVar47._0_4_ = auVar55._0_4_ * fVar191;
  auVar47._4_4_ = auVar55._4_4_ * fVar191;
  auVar47._8_4_ = auVar55._8_4_ * fVar191;
  auVar47._12_4_ = auVar55._12_4_ * fVar191;
  auVar41 = vsubps_avx(auVar48,auVar47);
  auVar48 = vrcp14ss_avx512f(auVar65._0_16_,auVar66._0_16_);
  auVar40 = vfnmadd213ss_avx512f(auVar40,auVar48,ZEXT416(0x40000000));
  fVar191 = auVar48._0_4_ * auVar40._0_4_;
  auVar40 = vshufps_avx512vl(auVar44,auVar44,0xff);
  auVar56._0_4_ = fVar166 * auVar40._0_4_;
  auVar56._4_4_ = fVar179 * auVar40._4_4_;
  auVar56._8_4_ = fVar180 * auVar40._8_4_;
  auVar56._12_4_ = fVar181 * auVar40._12_4_;
  auVar45 = vsubps_avx512vl(auVar44,auVar56);
  auVar48 = vshufps_avx512vl(auVar43,auVar43,0xff);
  auVar51._0_4_ = fVar166 * auVar48._0_4_ + auVar40._0_4_ * fVar202 * fVar207 * auVar49._0_4_;
  auVar51._4_4_ = fVar179 * auVar48._4_4_ + auVar40._4_4_ * fVar202 * fVar207 * auVar49._4_4_;
  auVar51._8_4_ = fVar180 * auVar48._8_4_ + auVar40._8_4_ * fVar202 * fVar207 * auVar49._8_4_;
  auVar51._12_4_ = fVar181 * auVar48._12_4_ + auVar40._12_4_ * fVar202 * fVar207 * auVar49._12_4_;
  auVar49 = vsubps_avx512vl(auVar43,auVar51);
  auVar47 = vaddps_avx512vl(auVar44,auVar56);
  auVar48 = vaddps_avx512vl(auVar43,auVar51);
  auVar40 = vshufps_avx512vl(auVar46,auVar46,0xff);
  auVar167._0_4_ = auVar158._0_4_ * auVar40._0_4_;
  auVar167._4_4_ = auVar158._4_4_ * auVar40._4_4_;
  auVar167._8_4_ = auVar158._8_4_ * auVar40._8_4_;
  auVar167._12_4_ = auVar158._12_4_ * auVar40._12_4_;
  auVar43 = vsubps_avx512vl(auVar46,auVar167);
  auVar55 = vshufps_avx512vl(auVar50,auVar50,0xff);
  auVar55 = vmulps_avx512vl(auVar55,auVar158);
  auVar139._0_4_ = auVar55._0_4_ + auVar40._0_4_ * fVar203 * auVar41._0_4_ * fVar191;
  auVar139._4_4_ = auVar55._4_4_ + auVar40._4_4_ * fVar203 * auVar41._4_4_ * fVar191;
  auVar139._8_4_ = auVar55._8_4_ + auVar40._8_4_ * fVar203 * auVar41._8_4_ * fVar191;
  auVar139._12_4_ = auVar55._12_4_ + auVar40._12_4_ * fVar203 * auVar41._12_4_ * fVar191;
  auVar40 = vsubps_avx(auVar50,auVar139);
  auVar46 = vaddps_avx512vl(auVar46,auVar167);
  auVar140._0_4_ = fVar204 + auVar139._0_4_;
  auVar140._4_4_ = fVar205 + auVar139._4_4_;
  auVar140._8_4_ = fVar206 + auVar139._8_4_;
  auVar140._12_4_ = fVar149 + auVar139._12_4_;
  auVar50 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaab));
  auVar41 = vmulps_avx512vl(auVar49,auVar50);
  auVar150._0_4_ = auVar45._0_4_ + auVar41._0_4_;
  auVar150._4_4_ = auVar45._4_4_ + auVar41._4_4_;
  auVar150._8_4_ = auVar45._8_4_ + auVar41._8_4_;
  auVar150._12_4_ = auVar45._12_4_ + auVar41._12_4_;
  auVar40 = vmulps_avx512vl(auVar40,auVar50);
  auVar53 = vsubps_avx(auVar43,auVar40);
  auVar40 = vmulps_avx512vl(auVar48,auVar50);
  auVar51 = vaddps_avx512vl(auVar47,auVar40);
  auVar41 = vmulps_avx512vl(auVar140,auVar50);
  auVar40 = *(undefined1 (*) [16])(lVar11 + lVar10 * lVar1);
  auVar54 = vsubps_avx(auVar46,auVar41);
  auVar41 = vmulps_avx512vl(auVar61,auVar65._0_16_);
  auVar49 = vfmadd231ps_avx512vl(auVar41,auVar60,auVar65._0_16_);
  auVar41 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar59,auVar49);
  auVar56 = vaddps_avx512vl(auVar58,auVar41);
  auVar41 = vfmadd231ps_avx512vl(auVar49,auVar59,auVar141);
  auVar57 = vfnmadd231ps_avx512vl(auVar41,auVar58,auVar141);
  auVar41 = vmulps_avx512vl(auVar40,auVar65._0_16_);
  auVar41 = vfmadd231ps_avx512vl(auVar41,auVar64,auVar65._0_16_);
  auVar49 = vxorps_avx512vl(auVar44,auVar44);
  auVar49 = vfmadd213ps_avx512vl(auVar49,auVar63,auVar41);
  auVar48 = vaddps_avx512vl(auVar62,auVar49);
  auVar41 = vfmadd231ps_avx512vl(auVar41,auVar63,auVar141);
  auVar55 = vfnmadd231ps_avx512vl(auVar41,auVar62,auVar141);
  auVar41 = vxorps_avx512vl(auVar49,auVar49);
  auVar41 = vfmadd213ps_avx512vl(auVar41,auVar60,auVar61);
  auVar41 = vfmadd231ps_avx512vl(auVar41,auVar59,auVar65._0_16_);
  auVar44 = vfmadd231ps_avx512vl(auVar41,auVar58,auVar65._0_16_);
  auVar41 = vmulps_avx512vl(auVar61,auVar141);
  auVar41 = vfnmadd231ps_avx512vl(auVar41,auVar141,auVar60);
  auVar41 = vfmadd231ps_avx512vl(auVar41,auVar65._0_16_,auVar59);
  auVar58 = vfnmadd231ps_avx512vl(auVar41,auVar65._0_16_,auVar58);
  auVar41 = vfmadd213ps_avx512vl(ZEXT816(0) << 0x20,auVar64,auVar40);
  auVar41 = vfmadd231ps_avx512vl(auVar41,auVar63,auVar65._0_16_);
  auVar52 = vfmadd231ps_avx512vl(auVar41,auVar62,auVar65._0_16_);
  auVar40 = vmulps_avx512vl(auVar40,auVar141);
  auVar40 = vfnmadd231ps_avx512vl(auVar40,auVar141,auVar64);
  auVar40 = vfmadd231ps_avx512vl(auVar40,auVar65._0_16_,auVar63);
  auVar59 = vfnmadd231ps_avx512vl(auVar40,auVar65._0_16_,auVar62);
  auVar40 = vshufps_avx(auVar57,auVar57,0xc9);
  auVar41 = vshufps_avx512vl(auVar48,auVar48,0xc9);
  fVar203 = auVar57._0_4_;
  auVar208._0_4_ = fVar203 * auVar41._0_4_;
  fVar204 = auVar57._4_4_;
  auVar208._4_4_ = fVar204 * auVar41._4_4_;
  fVar205 = auVar57._8_4_;
  auVar208._8_4_ = fVar205 * auVar41._8_4_;
  fVar206 = auVar57._12_4_;
  auVar208._12_4_ = fVar206 * auVar41._12_4_;
  auVar41 = vfmsub231ps_avx512vl(auVar208,auVar40,auVar48);
  auVar49 = vshufps_avx(auVar41,auVar41,0xc9);
  auVar41 = vshufps_avx(auVar55,auVar55,0xc9);
  auVar215._0_4_ = fVar203 * auVar41._0_4_;
  auVar215._4_4_ = fVar204 * auVar41._4_4_;
  auVar215._8_4_ = fVar205 * auVar41._8_4_;
  auVar215._12_4_ = fVar206 * auVar41._12_4_;
  auVar40 = vfmsub231ps_fma(auVar215,auVar40,auVar55);
  auVar48 = vshufps_avx(auVar40,auVar40,0xc9);
  auVar41 = vshufps_avx512vl(auVar58,auVar58,0xc9);
  auVar40 = vshufps_avx(auVar52,auVar52,0xc9);
  auVar40 = vmulps_avx512vl(auVar58,auVar40);
  auVar40 = vfmsub231ps_fma(auVar40,auVar41,auVar52);
  auVar55 = vshufps_avx(auVar40,auVar40,0xc9);
  auVar40 = vshufps_avx(auVar59,auVar59,0xc9);
  auVar40 = vmulps_avx512vl(auVar58,auVar40);
  auVar40 = vfmsub231ps_fma(auVar40,auVar41,auVar59);
  auVar52 = vshufps_avx(auVar40,auVar40,0xc9);
  auVar40 = vdpps_avx(auVar49,auVar49,0x7f);
  auVar78._16_16_ = auVar71._16_16_;
  auVar78._0_16_ = auVar65._0_16_;
  auVar68._4_28_ = auVar78._4_28_;
  auVar68._0_4_ = auVar40._0_4_;
  auVar41 = vrsqrt14ss_avx512f(auVar65._0_16_,auVar68._0_16_);
  auVar59 = vmulss_avx512f(auVar41,ZEXT416(0x3fc00000));
  auVar60 = vmulss_avx512f(auVar40,ZEXT416(0x3f000000));
  auVar60 = vmulss_avx512f(auVar60,auVar41);
  auVar41 = vmulss_avx512f(auVar60,ZEXT416((uint)(auVar41._0_4_ * auVar41._0_4_)));
  auVar41 = vsubss_avx512f(auVar59,auVar41);
  auVar226._0_4_ = auVar41._0_4_;
  auVar226._4_4_ = auVar226._0_4_;
  auVar226._8_4_ = auVar226._0_4_;
  auVar226._12_4_ = auVar226._0_4_;
  auVar41 = vdpps_avx(auVar49,auVar48,0x7f);
  auVar59 = vmulps_avx512vl(auVar49,auVar226);
  auVar60 = vbroadcastss_avx512vl(auVar40);
  auVar48 = vmulps_avx512vl(auVar60,auVar48);
  fVar207 = auVar41._0_4_;
  auVar61._0_4_ = auVar49._0_4_ * fVar207;
  auVar61._4_4_ = auVar49._4_4_ * fVar207;
  auVar61._8_4_ = auVar49._8_4_ * fVar207;
  auVar61._12_4_ = auVar49._12_4_ * fVar207;
  auVar49 = vsubps_avx(auVar48,auVar61);
  auVar41 = vrcp14ss_avx512f(auVar65._0_16_,auVar68._0_16_);
  auVar40 = vfnmadd213ss_avx512f(auVar40,auVar41,ZEXT416(0x40000000));
  fVar207 = auVar40._0_4_ * auVar41._0_4_;
  auVar40 = vdpps_avx(auVar55,auVar55,0x7f);
  auVar86._16_16_ = auVar71._16_16_;
  auVar86._0_16_ = auVar65._0_16_;
  auVar85._4_28_ = auVar86._4_28_;
  auVar85._0_4_ = auVar40._0_4_;
  auVar41 = vrsqrt14ss_avx512f(auVar65._0_16_,auVar85._0_16_);
  auVar48 = vmulss_avx512f(auVar41,ZEXT416(0x3fc00000));
  auVar71._16_16_ = vmulss_avx512f(auVar40,ZEXT416(0x3f000000));
  fVar191 = auVar41._0_4_;
  fVar202 = auVar48._0_4_ - auVar71._16_4_ * fVar191 * fVar191 * fVar191;
  auVar221._0_4_ = auVar55._0_4_ * fVar202;
  auVar221._4_4_ = auVar55._4_4_ * fVar202;
  auVar221._8_4_ = auVar55._8_4_ * fVar202;
  auVar221._12_4_ = auVar55._12_4_ * fVar202;
  auVar41 = vdpps_avx(auVar55,auVar52,0x7f);
  auVar48 = vbroadcastss_avx512vl(auVar40);
  auVar48 = vmulps_avx512vl(auVar48,auVar52);
  fVar191 = auVar41._0_4_;
  auVar182._0_4_ = auVar55._0_4_ * fVar191;
  auVar182._4_4_ = auVar55._4_4_ * fVar191;
  auVar182._8_4_ = auVar55._8_4_ * fVar191;
  auVar182._12_4_ = auVar55._12_4_ * fVar191;
  auVar41 = vsubps_avx(auVar48,auVar182);
  auVar48 = vrcp14ss_avx512f(auVar65._0_16_,auVar85._0_16_);
  auVar40 = vfnmadd213ss_avx512f(auVar40,auVar48,ZEXT416(0x40000000));
  auVar61 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar243 = ZEXT1664(auVar61);
  fVar191 = auVar48._0_4_ * auVar40._0_4_;
  auVar48 = vshufps_avx512vl(auVar56,auVar56,0xff);
  auVar55 = vmulps_avx512vl(auVar48,auVar59);
  auVar52 = vsubps_avx512vl(auVar56,auVar55);
  auVar40 = vshufps_avx(auVar57,auVar57,0xff);
  auVar40 = vmulps_avx512vl(auVar40,auVar59);
  auVar60._0_4_ = auVar40._0_4_ + auVar48._0_4_ * auVar226._0_4_ * fVar207 * auVar49._0_4_;
  auVar60._4_4_ = auVar40._4_4_ + auVar48._4_4_ * auVar226._0_4_ * fVar207 * auVar49._4_4_;
  auVar60._8_4_ = auVar40._8_4_ + auVar48._8_4_ * auVar226._0_4_ * fVar207 * auVar49._8_4_;
  auVar60._12_4_ = auVar40._12_4_ + auVar48._12_4_ * auVar226._0_4_ * fVar207 * auVar49._12_4_;
  auVar40 = vsubps_avx(auVar57,auVar60);
  auVar49 = vaddps_avx512vl(auVar56,auVar55);
  auVar62._0_4_ = fVar203 + auVar60._0_4_;
  auVar62._4_4_ = fVar204 + auVar60._4_4_;
  auVar62._8_4_ = fVar205 + auVar60._8_4_;
  auVar62._12_4_ = fVar206 + auVar60._12_4_;
  auVar48 = vshufps_avx512vl(auVar44,auVar44,0xff);
  auVar216._0_4_ = auVar48._0_4_ * auVar221._0_4_;
  auVar216._4_4_ = auVar48._4_4_ * auVar221._4_4_;
  auVar216._8_4_ = auVar48._8_4_ * auVar221._8_4_;
  auVar216._12_4_ = auVar48._12_4_ * auVar221._12_4_;
  auVar55 = vsubps_avx512vl(auVar44,auVar216);
  auVar71._16_16_ = vshufps_avx512vl(auVar58,auVar58,0xff);
  auVar71._16_16_ = vmulps_avx512vl(auVar71._16_16_,auVar221);
  auVar57._0_4_ = auVar71._16_4_ + auVar48._0_4_ * fVar202 * auVar41._0_4_ * fVar191;
  auVar57._4_4_ = auVar71._20_4_ + auVar48._4_4_ * fVar202 * auVar41._4_4_ * fVar191;
  auVar57._8_4_ = auVar71._24_4_ + auVar48._8_4_ * fVar202 * auVar41._8_4_ * fVar191;
  auVar57._12_4_ = auVar71._28_4_ + auVar48._12_4_ * fVar202 * auVar41._12_4_ * fVar191;
  auVar41 = vsubps_avx512vl(auVar58,auVar57);
  auVar48 = vaddps_avx512vl(auVar44,auVar216);
  auVar58 = vaddps_avx512vl(auVar58,auVar57);
  auVar40 = vmulps_avx512vl(auVar40,auVar50);
  auVar183._0_4_ = auVar52._0_4_ + auVar40._0_4_;
  auVar183._4_4_ = auVar52._4_4_ + auVar40._4_4_;
  auVar183._8_4_ = auVar52._8_4_ + auVar40._8_4_;
  auVar183._12_4_ = auVar52._12_4_ + auVar40._12_4_;
  auVar40 = vmulps_avx512vl(auVar41,auVar50);
  auVar40 = vsubps_avx(auVar55,auVar40);
  auVar41 = vmulps_avx512vl(auVar62,auVar50);
  auVar63._0_4_ = auVar49._0_4_ + auVar41._0_4_;
  auVar63._4_4_ = auVar49._4_4_ + auVar41._4_4_;
  auVar63._8_4_ = auVar49._8_4_ + auVar41._8_4_;
  auVar63._12_4_ = auVar49._12_4_ + auVar41._12_4_;
  auVar41 = vmulps_avx512vl(auVar58,auVar50);
  auVar242 = ZEXT464(0x3f800000);
  auVar41 = vsubps_avx(auVar48,auVar41);
  auVar58 = vbroadcastss_avx512vl(auVar42);
  auVar71._16_16_ = vsubss_avx512f(ZEXT416(0x3f800000),auVar42);
  auVar71._16_16_ = vbroadcastss_avx512vl(auVar71._16_16_);
  auVar52 = vmulps_avx512vl(auVar58,auVar52);
  auVar59 = vmulps_avx512vl(auVar58,auVar183);
  auVar40 = vmulps_avx512vl(auVar58,auVar40);
  auVar227._0_4_ = auVar58._0_4_ * auVar55._0_4_;
  auVar227._4_4_ = auVar58._4_4_ * auVar55._4_4_;
  auVar227._8_4_ = auVar58._8_4_ * auVar55._8_4_;
  auVar227._12_4_ = auVar58._12_4_ * auVar55._12_4_;
  local_1a8 = vfmadd231ps_avx512vl(auVar52,auVar71._16_16_,auVar45);
  local_1b8 = vfmadd231ps_avx512vl(auVar59,auVar71._16_16_,auVar150);
  local_1c8 = vfmadd231ps_avx512vl(auVar40,auVar71._16_16_,auVar53);
  local_1d8 = vfmadd231ps_avx512vl(auVar227,auVar71._16_16_,auVar43);
  auVar40 = vmulps_avx512vl(auVar58,auVar49);
  auVar49 = vmulps_avx512vl(auVar58,auVar63);
  auVar41 = vmulps_avx512vl(auVar58,auVar41);
  auVar217._0_4_ = auVar58._0_4_ * auVar48._0_4_;
  auVar217._4_4_ = auVar58._4_4_ * auVar48._4_4_;
  auVar217._8_4_ = auVar58._8_4_ * auVar48._8_4_;
  auVar217._12_4_ = auVar58._12_4_ * auVar48._12_4_;
  _local_1e8 = vfmadd231ps_avx512vl(auVar40,auVar71._16_16_,auVar47);
  _local_1f8 = vfmadd231ps_avx512vl(auVar49,auVar71._16_16_,auVar51);
  _local_208 = vfmadd231ps_avx512vl(auVar41,auVar71._16_16_,auVar54);
  _local_218 = vfmadd231ps_avx512vl(auVar217,auVar71._16_16_,auVar46);
  aVar3 = (ray->super_RayK<1>).org.field_0;
  auVar41 = vsubps_avx512vl(local_1a8,(undefined1  [16])aVar3);
  uVar105 = auVar41._0_4_;
  auVar42._4_4_ = uVar105;
  auVar42._0_4_ = uVar105;
  auVar42._8_4_ = uVar105;
  auVar42._12_4_ = uVar105;
  auVar40 = vshufps_avx(auVar41,auVar41,0x55);
  auVar41 = vshufps_avx(auVar41,auVar41,0xaa);
  aVar4 = (pre->ray_space).vx.field_0;
  aVar5 = (pre->ray_space).vy.field_0;
  fVar207 = (pre->ray_space).vz.field_0.m128[0];
  fVar191 = (pre->ray_space).vz.field_0.m128[1];
  fVar202 = (pre->ray_space).vz.field_0.m128[2];
  fVar203 = (pre->ray_space).vz.field_0.m128[3];
  auVar64._0_4_ = fVar207 * auVar41._0_4_;
  auVar64._4_4_ = fVar191 * auVar41._4_4_;
  auVar64._8_4_ = fVar202 * auVar41._8_4_;
  auVar64._12_4_ = fVar203 * auVar41._12_4_;
  auVar40 = vfmadd231ps_fma(auVar64,(undefined1  [16])aVar5,auVar40);
  auVar55 = vfmadd231ps_fma(auVar40,(undefined1  [16])aVar4,auVar42);
  auVar41 = vsubps_avx512vl(local_1b8,(undefined1  [16])aVar3);
  uVar105 = auVar41._0_4_;
  auVar44._4_4_ = uVar105;
  auVar44._0_4_ = uVar105;
  auVar44._8_4_ = uVar105;
  auVar44._12_4_ = uVar105;
  auVar40 = vshufps_avx(auVar41,auVar41,0x55);
  auVar41 = vshufps_avx(auVar41,auVar41,0xaa);
  auVar43._0_4_ = fVar207 * auVar41._0_4_;
  auVar43._4_4_ = fVar191 * auVar41._4_4_;
  auVar43._8_4_ = fVar202 * auVar41._8_4_;
  auVar43._12_4_ = fVar203 * auVar41._12_4_;
  auVar40 = vfmadd231ps_fma(auVar43,(undefined1  [16])aVar5,auVar40);
  auVar52 = vfmadd231ps_fma(auVar40,(undefined1  [16])aVar4,auVar44);
  auVar41 = vsubps_avx512vl(local_1c8,(undefined1  [16])aVar3);
  uVar105 = auVar41._0_4_;
  auVar141._4_4_ = uVar105;
  auVar141._0_4_ = uVar105;
  auVar141._8_4_ = uVar105;
  auVar141._12_4_ = uVar105;
  auVar40 = vshufps_avx(auVar41,auVar41,0x55);
  auVar41 = vshufps_avx(auVar41,auVar41,0xaa);
  auVar46._0_4_ = fVar207 * auVar41._0_4_;
  auVar46._4_4_ = fVar191 * auVar41._4_4_;
  auVar46._8_4_ = fVar202 * auVar41._8_4_;
  auVar46._12_4_ = fVar203 * auVar41._12_4_;
  auVar40 = vfmadd231ps_fma(auVar46,(undefined1  [16])aVar5,auVar40);
  auVar53 = vfmadd231ps_fma(auVar40,(undefined1  [16])aVar4,auVar141);
  auVar41 = vsubps_avx(local_1d8,(undefined1  [16])aVar3);
  uVar105 = auVar41._0_4_;
  auVar159._4_4_ = uVar105;
  auVar159._0_4_ = uVar105;
  auVar159._8_4_ = uVar105;
  auVar159._12_4_ = uVar105;
  auVar40 = vshufps_avx(auVar41,auVar41,0x55);
  auVar41 = vshufps_avx(auVar41,auVar41,0xaa);
  auVar142._0_4_ = fVar207 * auVar41._0_4_;
  auVar142._4_4_ = fVar191 * auVar41._4_4_;
  auVar142._8_4_ = fVar202 * auVar41._8_4_;
  auVar142._12_4_ = fVar203 * auVar41._12_4_;
  auVar40 = vfmadd231ps_fma(auVar142,(undefined1  [16])aVar5,auVar40);
  auVar54 = vfmadd231ps_fma(auVar40,(undefined1  [16])aVar4,auVar159);
  auVar41 = vsubps_avx512vl(_local_1e8,(undefined1  [16])aVar3);
  uVar105 = auVar41._0_4_;
  auVar168._4_4_ = uVar105;
  auVar168._0_4_ = uVar105;
  auVar168._8_4_ = uVar105;
  auVar168._12_4_ = uVar105;
  auVar40 = vshufps_avx(auVar41,auVar41,0x55);
  auVar41 = vshufps_avx(auVar41,auVar41,0xaa);
  auVar160._0_4_ = auVar41._0_4_ * fVar207;
  auVar160._4_4_ = auVar41._4_4_ * fVar191;
  auVar160._8_4_ = auVar41._8_4_ * fVar202;
  auVar160._12_4_ = auVar41._12_4_ * fVar203;
  auVar40 = vfmadd231ps_fma(auVar160,(undefined1  [16])aVar5,auVar40);
  auVar58 = vfmadd231ps_fma(auVar40,(undefined1  [16])aVar4,auVar168);
  auVar41 = vsubps_avx512vl(_local_1f8,(undefined1  [16])aVar3);
  uVar105 = auVar41._0_4_;
  auVar184._4_4_ = uVar105;
  auVar184._0_4_ = uVar105;
  auVar184._8_4_ = uVar105;
  auVar184._12_4_ = uVar105;
  auVar40 = vshufps_avx(auVar41,auVar41,0x55);
  auVar41 = vshufps_avx(auVar41,auVar41,0xaa);
  auVar169._0_4_ = auVar41._0_4_ * fVar207;
  auVar169._4_4_ = auVar41._4_4_ * fVar191;
  auVar169._8_4_ = auVar41._8_4_ * fVar202;
  auVar169._12_4_ = auVar41._12_4_ * fVar203;
  auVar40 = vfmadd231ps_fma(auVar169,(undefined1  [16])aVar5,auVar40);
  auVar71._16_16_ = vfmadd231ps_fma(auVar40,(undefined1  [16])aVar4,auVar184);
  auVar41 = vsubps_avx512vl(_local_208,(undefined1  [16])aVar3);
  uVar105 = auVar41._0_4_;
  auVar192._4_4_ = uVar105;
  auVar192._0_4_ = uVar105;
  auVar192._8_4_ = uVar105;
  auVar192._12_4_ = uVar105;
  auVar40 = vshufps_avx(auVar41,auVar41,0x55);
  auVar41 = vshufps_avx(auVar41,auVar41,0xaa);
  auVar185._0_4_ = auVar41._0_4_ * fVar207;
  auVar185._4_4_ = auVar41._4_4_ * fVar191;
  auVar185._8_4_ = auVar41._8_4_ * fVar202;
  auVar185._12_4_ = auVar41._12_4_ * fVar203;
  auVar40 = vfmadd231ps_fma(auVar185,(undefined1  [16])aVar5,auVar40);
  auVar59 = vfmadd231ps_fma(auVar40,(undefined1  [16])aVar4,auVar192);
  auVar41 = vsubps_avx(_local_218,(undefined1  [16])aVar3);
  uVar105 = auVar41._0_4_;
  auVar193._4_4_ = uVar105;
  auVar193._0_4_ = uVar105;
  auVar193._8_4_ = uVar105;
  auVar193._12_4_ = uVar105;
  auVar40 = vshufps_avx(auVar41,auVar41,0x55);
  auVar41 = vshufps_avx(auVar41,auVar41,0xaa);
  auVar50._0_4_ = fVar207 * auVar41._0_4_;
  auVar50._4_4_ = fVar191 * auVar41._4_4_;
  auVar50._8_4_ = fVar202 * auVar41._8_4_;
  auVar50._12_4_ = fVar203 * auVar41._12_4_;
  auVar40 = vfmadd231ps_fma(auVar50,(undefined1  [16])aVar5,auVar40);
  auVar60 = vfmadd231ps_fma(auVar40,(undefined1  [16])aVar4,auVar193);
  local_268 = vmovlhps_avx(auVar55,auVar58);
  local_278 = vmovlhps_avx(auVar52,auVar71._16_16_);
  local_288 = vmovlhps_avx512f(auVar53,auVar59);
  _local_108 = vmovlhps_avx512f(auVar54,auVar60);
  auVar41 = vminps_avx(local_268,local_278);
  auVar40 = vmaxps_avx(local_268,local_278);
  auVar49 = vminps_avx512vl(local_288,_local_108);
  auVar41 = vminps_avx(auVar41,auVar49);
  auVar49 = vmaxps_avx512vl(local_288,_local_108);
  auVar40 = vmaxps_avx(auVar40,auVar49);
  auVar49 = vshufpd_avx(auVar41,auVar41,3);
  auVar48 = vshufpd_avx(auVar40,auVar40,3);
  auVar41 = vminps_avx(auVar41,auVar49);
  auVar40 = vmaxps_avx(auVar40,auVar48);
  auVar41 = vandps_avx512vl(auVar41,auVar61);
  auVar40 = vandps_avx512vl(auVar40,auVar61);
  auVar40 = vmaxps_avx(auVar41,auVar40);
  auVar41 = vmovshdup_avx(auVar40);
  auVar40 = vmaxss_avx(auVar41,auVar40);
  lVar34 = uVar35 + 0xff;
  local_298._8_8_ = auVar55._0_8_;
  local_298._0_8_ = auVar55._0_8_;
  local_2a8._8_8_ = auVar52._0_8_;
  local_2a8._0_8_ = auVar52._0_8_;
  local_2b8 = vmovddup_avx512vl(auVar53);
  local_2c8 = vmovddup_avx512vl(auVar54);
  register0x00001348 = auVar58._0_8_;
  local_2d8 = auVar58._0_8_;
  register0x00001388 = auVar71._16_8_;
  local_2e8 = auVar71._16_8_;
  register0x00001408 = auVar59._0_8_;
  local_2f8 = auVar59._0_8_;
  register0x00001448 = auVar60._0_8_;
  local_308 = auVar60._0_8_;
  local_118 = ZEXT416((uint)(auVar40._0_4_ * 9.536743e-07));
  local_b8 = vbroadcastss_avx512vl(local_118);
  auVar40 = vxorps_avx512vl(local_b8._0_16_,auVar111);
  local_d8 = vbroadcastss_avx512vl(auVar40);
  local_328 = vsubps_avx(local_278,local_268);
  local_e8 = vsubps_avx512vl(local_288,local_278);
  local_f8 = vsubps_avx512vl(_local_108,local_288);
  local_128 = vsubps_avx512vl(_local_1e8,local_1a8);
  local_138 = vsubps_avx512vl(_local_1f8,local_1b8);
  local_148 = vsubps_avx512vl(_local_208,local_1c8);
  _local_158 = vsubps_avx(_local_218,local_1d8);
  uVar28 = 0;
  auVar40 = ZEXT816(0x3f80000000000000);
  auVar59 = auVar40;
LAB_01b0ee4c:
  auVar41 = vshufps_avx(auVar59,auVar59,0x50);
  auVar222._8_4_ = 0x3f800000;
  auVar222._0_8_ = 0x3f8000003f800000;
  auVar222._12_4_ = 0x3f800000;
  auVar225._16_4_ = 0x3f800000;
  auVar225._0_16_ = auVar222;
  auVar225._20_4_ = 0x3f800000;
  auVar225._24_4_ = 0x3f800000;
  auVar225._28_4_ = 0x3f800000;
  auVar49 = vsubps_avx(auVar222,auVar41);
  fVar207 = auVar41._0_4_;
  auVar124._0_4_ = local_2d8._0_4_ * fVar207;
  fVar191 = auVar41._4_4_;
  auVar124._4_4_ = local_2d8._4_4_ * fVar191;
  fVar202 = auVar41._8_4_;
  auVar124._8_4_ = local_2d8._8_4_ * fVar202;
  fVar203 = auVar41._12_4_;
  auVar124._12_4_ = local_2d8._12_4_ * fVar203;
  auVar128._0_4_ = local_2e8._0_4_ * fVar207;
  auVar128._4_4_ = local_2e8._4_4_ * fVar191;
  auVar128._8_4_ = local_2e8._8_4_ * fVar202;
  auVar128._12_4_ = local_2e8._12_4_ * fVar203;
  auVar143._0_4_ = local_2f8._0_4_ * fVar207;
  auVar143._4_4_ = local_2f8._4_4_ * fVar191;
  auVar143._8_4_ = local_2f8._8_4_ * fVar202;
  auVar143._12_4_ = local_2f8._12_4_ * fVar203;
  auVar111._0_4_ = local_308._0_4_ * fVar207;
  auVar111._4_4_ = local_308._4_4_ * fVar191;
  auVar111._8_4_ = local_308._8_4_ * fVar202;
  auVar111._12_4_ = local_308._12_4_ * fVar203;
  auVar48 = vfmadd231ps_fma(auVar124,auVar49,local_298);
  auVar55 = vfmadd231ps_fma(auVar128,auVar49,local_2a8);
  auVar52 = vfmadd231ps_avx512vl(auVar143,auVar49,local_2b8);
  auVar49 = vfmadd231ps_avx512vl(auVar111,local_2c8,auVar49);
  auVar41 = vmovshdup_avx(auVar40);
  fVar191 = auVar40._0_4_;
  fVar207 = (auVar41._0_4_ - fVar191) * 0.04761905;
  auVar165._4_4_ = fVar191;
  auVar165._0_4_ = fVar191;
  auVar165._8_4_ = fVar191;
  auVar165._12_4_ = fVar191;
  auVar165._16_4_ = fVar191;
  auVar165._20_4_ = fVar191;
  auVar165._24_4_ = fVar191;
  auVar165._28_4_ = fVar191;
  auVar122._0_8_ = auVar41._0_8_;
  auVar122._8_8_ = auVar122._0_8_;
  auVar122._16_8_ = auVar122._0_8_;
  auVar122._24_8_ = auVar122._0_8_;
  auVar83 = vsubps_avx(auVar122,auVar165);
  uVar105 = auVar48._0_4_;
  auVar123._4_4_ = uVar105;
  auVar123._0_4_ = uVar105;
  auVar123._8_4_ = uVar105;
  auVar123._12_4_ = uVar105;
  auVar123._16_4_ = uVar105;
  auVar123._20_4_ = uVar105;
  auVar123._24_4_ = uVar105;
  auVar123._28_4_ = uVar105;
  auVar188._8_4_ = 1;
  auVar188._0_8_ = 0x100000001;
  auVar188._12_4_ = 1;
  auVar188._16_4_ = 1;
  auVar188._20_4_ = 1;
  auVar188._24_4_ = 1;
  auVar188._28_4_ = 1;
  auVar84 = ZEXT1632(auVar48);
  auVar81 = vpermps_avx2(auVar188,auVar84);
  auVar87 = vbroadcastss_avx512vl(auVar55);
  auVar82 = ZEXT1632(auVar55);
  auVar80 = vpermps_avx512vl(auVar188,auVar82);
  auVar79 = vbroadcastss_avx512vl(auVar52);
  auVar67 = ZEXT1632(auVar52);
  auVar73 = vpermps_avx512vl(auVar188,auVar67);
  auVar74 = vbroadcastss_avx512vl(auVar49);
  auVar66 = ZEXT1632(auVar49);
  auVar88 = vpermps_avx512vl(auVar188,auVar66);
  auVar189._4_4_ = fVar207;
  auVar189._0_4_ = fVar207;
  auVar189._8_4_ = fVar207;
  auVar189._12_4_ = fVar207;
  auVar189._16_4_ = fVar207;
  auVar189._20_4_ = fVar207;
  auVar189._24_4_ = fVar207;
  auVar189._28_4_ = fVar207;
  auVar89 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar90 = vpermps_avx512vl(auVar89,auVar84);
  auVar157._8_4_ = 3;
  auVar157._0_8_ = 0x300000003;
  auVar157._12_4_ = 3;
  auVar157._16_4_ = 3;
  auVar157._20_4_ = 3;
  auVar157._24_4_ = 3;
  auVar157._28_4_ = 3;
  auVar91 = vpermps_avx512vl(auVar157,auVar84);
  auVar92 = vpermps_avx512vl(auVar89,auVar82);
  auVar84 = vpermps_avx2(auVar157,auVar82);
  auVar65 = vpermps_avx512vl(auVar89,auVar67);
  auVar82 = vpermps_avx2(auVar157,auVar67);
  auVar89 = vpermps_avx512vl(auVar89,auVar66);
  auVar66 = vpermps_avx512vl(auVar157,auVar66);
  auVar41 = vfmadd132ps_fma(auVar83,auVar165,_DAT_01f7b040);
  auVar83 = vsubps_avx(auVar225,ZEXT1632(auVar41));
  auVar67 = vmulps_avx512vl(auVar87,ZEXT1632(auVar41));
  auVar69 = ZEXT1632(auVar41);
  auVar68 = vmulps_avx512vl(auVar80,auVar69);
  auVar49 = vfmadd231ps_fma(auVar67,auVar83,auVar123);
  auVar48 = vfmadd231ps_fma(auVar68,auVar83,auVar81);
  auVar67 = vmulps_avx512vl(auVar79,auVar69);
  auVar68 = vmulps_avx512vl(auVar73,auVar69);
  auVar87 = vfmadd231ps_avx512vl(auVar67,auVar83,auVar87);
  auVar80 = vfmadd231ps_avx512vl(auVar68,auVar83,auVar80);
  auVar67 = vmulps_avx512vl(auVar74,auVar69);
  auVar68 = ZEXT1632(auVar41);
  auVar88 = vmulps_avx512vl(auVar88,auVar68);
  auVar79 = vfmadd231ps_avx512vl(auVar67,auVar83,auVar79);
  auVar73 = vfmadd231ps_avx512vl(auVar88,auVar83,auVar73);
  fVar202 = auVar41._0_4_;
  fVar203 = auVar41._4_4_;
  auVar20._4_4_ = fVar203 * auVar87._4_4_;
  auVar20._0_4_ = fVar202 * auVar87._0_4_;
  fVar204 = auVar41._8_4_;
  auVar20._8_4_ = fVar204 * auVar87._8_4_;
  fVar205 = auVar41._12_4_;
  auVar20._12_4_ = fVar205 * auVar87._12_4_;
  auVar20._16_4_ = auVar87._16_4_ * 0.0;
  auVar20._20_4_ = auVar87._20_4_ * 0.0;
  auVar20._24_4_ = auVar87._24_4_ * 0.0;
  auVar20._28_4_ = fVar191;
  auVar21._4_4_ = fVar203 * auVar80._4_4_;
  auVar21._0_4_ = fVar202 * auVar80._0_4_;
  auVar21._8_4_ = fVar204 * auVar80._8_4_;
  auVar21._12_4_ = fVar205 * auVar80._12_4_;
  auVar21._16_4_ = auVar80._16_4_ * 0.0;
  auVar21._20_4_ = auVar80._20_4_ * 0.0;
  auVar21._24_4_ = auVar80._24_4_ * 0.0;
  auVar21._28_4_ = auVar81._28_4_;
  auVar49 = vfmadd231ps_fma(auVar20,auVar83,ZEXT1632(auVar49));
  auVar48 = vfmadd231ps_fma(auVar21,auVar83,ZEXT1632(auVar48));
  auVar116._0_4_ = fVar202 * auVar79._0_4_;
  auVar116._4_4_ = fVar203 * auVar79._4_4_;
  auVar116._8_4_ = fVar204 * auVar79._8_4_;
  auVar116._12_4_ = fVar205 * auVar79._12_4_;
  auVar116._16_4_ = auVar79._16_4_ * 0.0;
  auVar116._20_4_ = auVar79._20_4_ * 0.0;
  auVar116._24_4_ = auVar79._24_4_ * 0.0;
  auVar116._28_4_ = 0;
  auVar22._4_4_ = fVar203 * auVar73._4_4_;
  auVar22._0_4_ = fVar202 * auVar73._0_4_;
  auVar22._8_4_ = fVar204 * auVar73._8_4_;
  auVar22._12_4_ = fVar205 * auVar73._12_4_;
  auVar22._16_4_ = auVar73._16_4_ * 0.0;
  auVar22._20_4_ = auVar73._20_4_ * 0.0;
  auVar22._24_4_ = auVar73._24_4_ * 0.0;
  auVar22._28_4_ = auVar79._28_4_;
  auVar55 = vfmadd231ps_fma(auVar116,auVar83,auVar87);
  auVar52 = vfmadd231ps_fma(auVar22,auVar83,auVar80);
  auVar23._28_4_ = auVar80._28_4_;
  auVar23._0_28_ =
       ZEXT1628(CONCAT412(fVar205 * auVar52._12_4_,
                          CONCAT48(fVar204 * auVar52._8_4_,
                                   CONCAT44(fVar203 * auVar52._4_4_,fVar202 * auVar52._0_4_))));
  auVar53 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar205 * auVar55._12_4_,
                                               CONCAT48(fVar204 * auVar55._8_4_,
                                                        CONCAT44(fVar203 * auVar55._4_4_,
                                                                 fVar202 * auVar55._0_4_)))),auVar83
                            ,ZEXT1632(auVar49));
  auVar54 = vfmadd231ps_fma(auVar23,auVar83,ZEXT1632(auVar48));
  auVar81 = vsubps_avx(ZEXT1632(auVar55),ZEXT1632(auVar49));
  auVar87 = vsubps_avx(ZEXT1632(auVar52),ZEXT1632(auVar48));
  auVar80 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
  auVar81 = vmulps_avx512vl(auVar81,auVar80);
  auVar87 = vmulps_avx512vl(auVar87,auVar80);
  auVar178._0_4_ = fVar207 * auVar81._0_4_;
  auVar178._4_4_ = fVar207 * auVar81._4_4_;
  auVar178._8_4_ = fVar207 * auVar81._8_4_;
  auVar178._12_4_ = fVar207 * auVar81._12_4_;
  auVar178._16_4_ = fVar207 * auVar81._16_4_;
  auVar178._20_4_ = fVar207 * auVar81._20_4_;
  auVar178._24_4_ = fVar207 * auVar81._24_4_;
  auVar178._28_4_ = 0;
  auVar81 = vmulps_avx512vl(auVar189,auVar87);
  auVar48 = vxorps_avx512vl(auVar74._0_16_,auVar74._0_16_);
  auVar87 = vpermt2ps_avx512vl(ZEXT1632(auVar53),_DAT_01fb9fc0,ZEXT1632(auVar48));
  auVar79 = vpermt2ps_avx512vl(ZEXT1632(auVar54),_DAT_01fb9fc0,ZEXT1632(auVar48));
  auVar117._0_4_ = auVar178._0_4_ + auVar53._0_4_;
  auVar117._4_4_ = auVar178._4_4_ + auVar53._4_4_;
  auVar117._8_4_ = auVar178._8_4_ + auVar53._8_4_;
  auVar117._12_4_ = auVar178._12_4_ + auVar53._12_4_;
  auVar117._16_4_ = auVar178._16_4_ + 0.0;
  auVar117._20_4_ = auVar178._20_4_ + 0.0;
  auVar117._24_4_ = auVar178._24_4_ + 0.0;
  auVar117._28_4_ = 0;
  auVar69 = ZEXT1632(auVar48);
  auVar73 = vpermt2ps_avx512vl(auVar178,_DAT_01fb9fc0,auVar69);
  auVar74 = vaddps_avx512vl(ZEXT1632(auVar54),auVar81);
  auVar88 = vpermt2ps_avx512vl(auVar81,_DAT_01fb9fc0,auVar69);
  auVar81 = vsubps_avx(auVar87,auVar73);
  auVar73 = vsubps_avx512vl(auVar79,auVar88);
  auVar88 = vmulps_avx512vl(auVar92,auVar68);
  auVar67 = vmulps_avx512vl(auVar84,auVar68);
  auVar88 = vfmadd231ps_avx512vl(auVar88,auVar83,auVar90);
  auVar90 = vfmadd231ps_avx512vl(auVar67,auVar83,auVar91);
  auVar91 = vmulps_avx512vl(auVar65,auVar68);
  auVar67 = vmulps_avx512vl(auVar82,auVar68);
  auVar91 = vfmadd231ps_avx512vl(auVar91,auVar83,auVar92);
  auVar84 = vfmadd231ps_avx512vl(auVar67,auVar83,auVar84);
  auVar89 = vmulps_avx512vl(auVar89,auVar68);
  auVar92 = vmulps_avx512vl(auVar66,auVar68);
  auVar49 = vfmadd231ps_fma(auVar89,auVar83,auVar65);
  auVar89 = vfmadd231ps_avx512vl(auVar92,auVar83,auVar82);
  auVar92 = vmulps_avx512vl(auVar68,auVar91);
  auVar66 = ZEXT1632(auVar41);
  auVar65 = vmulps_avx512vl(auVar66,auVar84);
  auVar88 = vfmadd231ps_avx512vl(auVar92,auVar83,auVar88);
  auVar90 = vfmadd231ps_avx512vl(auVar65,auVar83,auVar90);
  auVar89 = vmulps_avx512vl(auVar66,auVar89);
  auVar91 = vfmadd231ps_avx512vl
                      (ZEXT1632(CONCAT412(fVar205 * auVar49._12_4_,
                                          CONCAT48(fVar204 * auVar49._8_4_,
                                                   CONCAT44(fVar203 * auVar49._4_4_,
                                                            fVar202 * auVar49._0_4_)))),auVar83,
                       auVar91);
  auVar84 = vfmadd231ps_avx512vl(auVar89,auVar83,auVar84);
  auVar24._4_4_ = fVar203 * auVar91._4_4_;
  auVar24._0_4_ = fVar202 * auVar91._0_4_;
  auVar24._8_4_ = fVar204 * auVar91._8_4_;
  auVar24._12_4_ = fVar205 * auVar91._12_4_;
  auVar24._16_4_ = auVar91._16_4_ * 0.0;
  auVar24._20_4_ = auVar91._20_4_ * 0.0;
  auVar24._24_4_ = auVar91._24_4_ * 0.0;
  auVar24._28_4_ = auVar82._28_4_;
  auVar82 = vmulps_avx512vl(auVar66,auVar84);
  auVar89 = vfmadd231ps_avx512vl(auVar24,auVar83,auVar88);
  auVar82 = vfmadd231ps_avx512vl(auVar82,auVar90,auVar83);
  auVar83 = vsubps_avx512vl(auVar91,auVar88);
  auVar84 = vsubps_avx512vl(auVar84,auVar90);
  auVar83 = vmulps_avx512vl(auVar83,auVar80);
  auVar84 = vmulps_avx512vl(auVar84,auVar80);
  fVar191 = fVar207 * auVar83._0_4_;
  fVar202 = fVar207 * auVar83._4_4_;
  auVar25._4_4_ = fVar202;
  auVar25._0_4_ = fVar191;
  fVar203 = fVar207 * auVar83._8_4_;
  auVar25._8_4_ = fVar203;
  fVar204 = fVar207 * auVar83._12_4_;
  auVar25._12_4_ = fVar204;
  fVar205 = fVar207 * auVar83._16_4_;
  auVar25._16_4_ = fVar205;
  fVar206 = fVar207 * auVar83._20_4_;
  auVar25._20_4_ = fVar206;
  fVar207 = fVar207 * auVar83._24_4_;
  auVar25._24_4_ = fVar207;
  auVar25._28_4_ = auVar83._28_4_;
  auVar84 = vmulps_avx512vl(auVar189,auVar84);
  auVar80 = vpermt2ps_avx512vl(auVar89,_DAT_01fb9fc0,auVar69);
  auVar88 = vpermt2ps_avx512vl(auVar82,_DAT_01fb9fc0,auVar69);
  auVar190._0_4_ = auVar89._0_4_ + fVar191;
  auVar190._4_4_ = auVar89._4_4_ + fVar202;
  auVar190._8_4_ = auVar89._8_4_ + fVar203;
  auVar190._12_4_ = auVar89._12_4_ + fVar204;
  auVar190._16_4_ = auVar89._16_4_ + fVar205;
  auVar190._20_4_ = auVar89._20_4_ + fVar206;
  auVar190._24_4_ = auVar89._24_4_ + fVar207;
  auVar190._28_4_ = auVar89._28_4_ + auVar83._28_4_;
  auVar83 = vpermt2ps_avx512vl(auVar25,_DAT_01fb9fc0,ZEXT1632(auVar48));
  auVar90 = vaddps_avx512vl(auVar82,auVar84);
  auVar84 = vpermt2ps_avx512vl(auVar84,_DAT_01fb9fc0,ZEXT1632(auVar48));
  auVar83 = vsubps_avx(auVar80,auVar83);
  auVar84 = vsubps_avx512vl(auVar88,auVar84);
  auVar72 = ZEXT1632(auVar53);
  auVar91 = vsubps_avx512vl(auVar89,auVar72);
  auVar75 = ZEXT1632(auVar54);
  auVar92 = vsubps_avx512vl(auVar82,auVar75);
  auVar65 = vsubps_avx512vl(auVar80,auVar87);
  auVar91 = vaddps_avx512vl(auVar91,auVar65);
  auVar65 = vsubps_avx512vl(auVar88,auVar79);
  auVar92 = vaddps_avx512vl(auVar92,auVar65);
  auVar65 = vmulps_avx512vl(auVar75,auVar91);
  auVar65 = vfnmadd231ps_avx512vl(auVar65,auVar72,auVar92);
  auVar66 = vmulps_avx512vl(auVar74,auVar91);
  auVar66 = vfnmadd231ps_avx512vl(auVar66,auVar117,auVar92);
  auVar67 = vmulps_avx512vl(auVar73,auVar91);
  auVar67 = vfnmadd231ps_avx512vl(auVar67,auVar81,auVar92);
  auVar68 = vmulps_avx512vl(auVar79,auVar91);
  auVar68 = vfnmadd231ps_avx512vl(auVar68,auVar87,auVar92);
  auVar69 = vmulps_avx512vl(auVar82,auVar91);
  auVar69 = vfnmadd231ps_avx512vl(auVar69,auVar89,auVar92);
  auVar70 = vmulps_avx512vl(auVar90,auVar91);
  auVar70 = vfnmadd231ps_avx512vl(auVar70,auVar190,auVar92);
  auVar71 = vmulps_avx512vl(auVar84,auVar91);
  auVar71 = vfnmadd231ps_avx512vl(auVar71,auVar83,auVar92);
  auVar91 = vmulps_avx512vl(auVar88,auVar91);
  auVar91 = vfnmadd231ps_avx512vl(auVar91,auVar80,auVar92);
  auVar92 = vminps_avx512vl(auVar65,auVar66);
  auVar65 = vmaxps_avx512vl(auVar65,auVar66);
  auVar66 = vminps_avx512vl(auVar67,auVar68);
  auVar92 = vminps_avx512vl(auVar92,auVar66);
  auVar66 = vmaxps_avx512vl(auVar67,auVar68);
  auVar65 = vmaxps_avx512vl(auVar65,auVar66);
  auVar66 = vminps_avx512vl(auVar69,auVar70);
  auVar67 = vmaxps_avx512vl(auVar69,auVar70);
  auVar68 = vminps_avx512vl(auVar71,auVar91);
  auVar66 = vminps_avx512vl(auVar66,auVar68);
  auVar92 = vminps_avx512vl(auVar92,auVar66);
  auVar91 = vmaxps_avx512vl(auVar71,auVar91);
  auVar91 = vmaxps_avx512vl(auVar67,auVar91);
  auVar91 = vmaxps_avx512vl(auVar65,auVar91);
  auVar41 = auVar91._0_16_;
  uVar14 = vcmpps_avx512vl(auVar92,local_b8,2);
  uVar15 = vcmpps_avx512vl(auVar91,local_d8,5);
  bVar26 = (byte)uVar14 & (byte)uVar15 & 0x7f;
  if (bVar26 != 0) {
    auVar91 = vsubps_avx512vl(auVar87,auVar72);
    auVar92 = vsubps_avx512vl(auVar79,auVar75);
    auVar65 = vsubps_avx512vl(auVar80,auVar89);
    auVar91 = vaddps_avx512vl(auVar91,auVar65);
    auVar41 = auVar91._0_16_;
    auVar65 = vsubps_avx512vl(auVar88,auVar82);
    auVar92 = vaddps_avx512vl(auVar92,auVar65);
    auVar65 = vmulps_avx512vl(auVar75,auVar91);
    auVar65 = vfnmadd231ps_avx512vl(auVar65,auVar92,auVar72);
    auVar74 = vmulps_avx512vl(auVar74,auVar91);
    auVar74 = vfnmadd213ps_avx512vl(auVar117,auVar92,auVar74);
    auVar73 = vmulps_avx512vl(auVar73,auVar91);
    auVar73 = vfnmadd213ps_avx512vl(auVar81,auVar92,auVar73);
    auVar81 = vmulps_avx512vl(auVar79,auVar91);
    auVar79 = vfnmadd231ps_avx512vl(auVar81,auVar92,auVar87);
    auVar81 = vmulps_avx512vl(auVar82,auVar91);
    auVar82 = vfnmadd231ps_avx512vl(auVar81,auVar92,auVar89);
    auVar81 = vmulps_avx512vl(auVar90,auVar91);
    auVar89 = vfnmadd213ps_avx512vl(auVar190,auVar92,auVar81);
    auVar81 = vmulps_avx512vl(auVar84,auVar91);
    auVar90 = vfnmadd213ps_avx512vl(auVar83,auVar92,auVar81);
    auVar83 = vmulps_avx512vl(auVar88,auVar91);
    auVar80 = vfnmadd231ps_avx512vl(auVar83,auVar80,auVar92);
    auVar81 = vminps_avx(auVar65,auVar74);
    auVar83 = vmaxps_avx(auVar65,auVar74);
    auVar87 = vminps_avx(auVar73,auVar79);
    auVar87 = vminps_avx(auVar81,auVar87);
    auVar81 = vmaxps_avx(auVar73,auVar79);
    auVar83 = vmaxps_avx(auVar83,auVar81);
    auVar84 = vminps_avx(auVar82,auVar89);
    auVar81 = vmaxps_avx(auVar82,auVar89);
    auVar82 = vminps_avx(auVar90,auVar80);
    auVar84 = vminps_avx(auVar84,auVar82);
    auVar84 = vminps_avx(auVar87,auVar84);
    auVar87 = vmaxps_avx(auVar90,auVar80);
    auVar81 = vmaxps_avx(auVar81,auVar87);
    auVar83 = vmaxps_avx(auVar83,auVar81);
    uVar14 = vcmpps_avx512vl(auVar83,local_d8,5);
    uVar15 = vcmpps_avx512vl(auVar84,local_b8,2);
    bVar26 = bVar26 & (byte)uVar14 & (byte)uVar15;
    if (bVar26 != 0) {
      auStack_198[uVar28] = (uint)bVar26;
      uVar14 = vmovlps_avx(auVar40);
      (&uStack_98)[uVar28] = uVar14;
      uVar2 = vmovlps_avx(auVar59);
      auStack_58[uVar28] = uVar2;
      uVar28 = (ulong)((int)uVar28 + 1);
    }
  }
  auVar40 = vxorps_avx512vl(auVar41,auVar41);
  auVar233 = ZEXT1664(auVar40);
  auVar40 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
  auVar239 = ZEXT1664(auVar40);
  auVar40 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
  auVar234 = ZEXT1664(auVar40);
  auVar83 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
  auVar235 = ZEXT3264(auVar83);
  auVar40 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
  auVar236 = ZEXT1664(auVar40);
  auVar40 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar237 = ZEXT1664(auVar40);
  auVar238 = ZEXT464(0x3e2aaaab);
  auVar240 = ZEXT3264(_DAT_01fb9fe0);
  auVar71._16_16_ = DAT_01fb9fe0._16_16_;
  auVar241 = ZEXT1664(local_328);
LAB_01b0f343:
  do {
    do {
      do {
        auVar41 = auVar233._0_16_;
        auVar49 = auVar239._0_16_;
        if ((int)uVar28 == 0) {
          fVar207 = (ray->super_RayK<1>).tfar;
          auVar19._4_4_ = fVar207;
          auVar19._0_4_ = fVar207;
          auVar19._8_4_ = fVar207;
          auVar19._12_4_ = fVar207;
          auVar19._16_4_ = fVar207;
          auVar19._20_4_ = fVar207;
          auVar19._24_4_ = fVar207;
          auVar19._28_4_ = fVar207;
          uVar14 = vcmpps_avx512vl(local_78,auVar19,2);
          uVar35 = (ulong)((uint)uVar35 & (uint)lVar34 & (uint)uVar14);
          goto LAB_01b0e3c6;
        }
        uVar27 = (int)uVar28 - 1;
        uVar29 = (ulong)uVar27;
        uVar7 = auStack_198[uVar29];
        auVar59._8_8_ = 0;
        auVar59._0_8_ = auStack_58[uVar29];
        uVar2 = 0;
        for (uVar33 = (ulong)uVar7; (uVar33 & 1) == 0; uVar33 = uVar33 >> 1 | 0x8000000000000000) {
          uVar2 = uVar2 + 1;
        }
        uVar31 = uVar7 - 1 & uVar7;
        bVar38 = uVar31 == 0;
        auStack_198[uVar29] = uVar31;
        if (bVar38) {
          uVar28 = (ulong)uVar27;
        }
        auVar106._8_8_ = 0;
        auVar106._0_8_ = uVar2;
        auVar40 = vpunpcklqdq_avx(auVar106,ZEXT416((int)uVar2 + 1));
        auVar40 = vcvtqq2ps_avx512vl(auVar40);
        auVar40 = vmulps_avx512vl(auVar40,auVar236._0_16_);
        uVar105 = *(undefined4 *)((long)&uStack_98 + uVar29 * 8 + 4);
        auVar16._4_4_ = uVar105;
        auVar16._0_4_ = uVar105;
        auVar16._8_4_ = uVar105;
        auVar16._12_4_ = uVar105;
        auVar48 = vmulps_avx512vl(auVar40,auVar16);
        auVar55 = auVar237._0_16_;
        auVar40 = vsubps_avx512vl(auVar55,auVar40);
        uVar105 = *(undefined4 *)(&uStack_98 + uVar29);
        auVar17._4_4_ = uVar105;
        auVar17._0_4_ = uVar105;
        auVar17._8_4_ = uVar105;
        auVar17._12_4_ = uVar105;
        auVar40 = vfmadd231ps_avx512vl(auVar48,auVar40,auVar17);
        auVar48 = vmovshdup_avx(auVar40);
        fVar207 = auVar48._0_4_ - auVar40._0_4_;
        auVar48 = vucomiss_avx512f(ZEXT416((uint)fVar207));
        auVar238 = ZEXT1664(auVar48);
        if (uVar7 == 0 || bVar38) goto LAB_01b0ee4c;
        auVar48 = vshufps_avx(auVar59,auVar59,0x50);
        vucomiss_avx512f(ZEXT416((uint)fVar207));
        auVar54 = vsubps_avx512vl(auVar55,auVar48);
        fVar191 = auVar48._0_4_;
        auVar129._0_4_ = fVar191 * (float)local_2d8._0_4_;
        fVar202 = auVar48._4_4_;
        auVar129._4_4_ = fVar202 * (float)local_2d8._4_4_;
        fVar203 = auVar48._8_4_;
        auVar129._8_4_ = fVar203 * fStack_2d0;
        fVar204 = auVar48._12_4_;
        auVar129._12_4_ = fVar204 * fStack_2cc;
        auVar144._0_4_ = fVar191 * (float)local_2e8._0_4_;
        auVar144._4_4_ = fVar202 * (float)local_2e8._4_4_;
        auVar144._8_4_ = fVar203 * fStack_2e0;
        auVar144._12_4_ = fVar204 * fStack_2dc;
        auVar151._0_4_ = fVar191 * (float)local_2f8._0_4_;
        auVar151._4_4_ = fVar202 * (float)local_2f8._4_4_;
        auVar151._8_4_ = fVar203 * fStack_2f0;
        auVar151._12_4_ = fVar204 * fStack_2ec;
        auVar118._0_4_ = fVar191 * (float)local_308._0_4_;
        auVar118._4_4_ = fVar202 * (float)local_308._4_4_;
        auVar118._8_4_ = fVar203 * fStack_300;
        auVar118._12_4_ = fVar204 * fStack_2fc;
        auVar48 = vfmadd231ps_fma(auVar129,auVar54,local_298);
        auVar52 = vfmadd231ps_fma(auVar144,auVar54,local_2a8);
        auVar53 = vfmadd231ps_fma(auVar151,auVar54,local_2b8);
        auVar54 = vfmadd231ps_fma(auVar118,auVar54,local_2c8);
        auVar127._16_16_ = auVar48;
        auVar127._0_16_ = auVar48;
        auVar135._16_16_ = auVar52;
        auVar135._0_16_ = auVar52;
        auVar148._16_16_ = auVar53;
        auVar148._0_16_ = auVar53;
        auVar81 = vpermps_avx512vl(auVar240._0_32_,ZEXT1632(auVar40));
        auVar83 = vsubps_avx(auVar135,auVar127);
        auVar52 = vfmadd213ps_fma(auVar83,auVar81,auVar127);
        auVar83 = vsubps_avx(auVar148,auVar135);
        auVar58 = vfmadd213ps_fma(auVar83,auVar81,auVar135);
        auVar48 = vsubps_avx(auVar54,auVar53);
        auVar136._16_16_ = auVar48;
        auVar136._0_16_ = auVar48;
        auVar48 = vfmadd213ps_fma(auVar136,auVar81,auVar148);
        auVar83 = vsubps_avx(ZEXT1632(auVar58),ZEXT1632(auVar52));
        auVar52 = vfmadd213ps_fma(auVar83,auVar81,ZEXT1632(auVar52));
        auVar83 = vsubps_avx(ZEXT1632(auVar48),ZEXT1632(auVar58));
        auVar48 = vfmadd213ps_fma(auVar83,auVar81,ZEXT1632(auVar58));
        auVar83 = vsubps_avx(ZEXT1632(auVar48),ZEXT1632(auVar52));
        auVar43 = vfmadd231ps_fma(ZEXT1632(auVar52),auVar83,auVar81);
        auVar83 = vmulps_avx512vl(auVar83,auVar235._0_32_);
        auVar71._16_16_ = auVar83._16_16_;
        fVar191 = fVar207 * 0.33333334;
        auVar152._0_8_ =
             CONCAT44(auVar43._4_4_ + fVar191 * auVar83._4_4_,
                      auVar43._0_4_ + fVar191 * auVar83._0_4_);
        auVar152._8_4_ = auVar43._8_4_ + fVar191 * auVar83._8_4_;
        auVar152._12_4_ = auVar43._12_4_ + fVar191 * auVar83._12_4_;
        auVar130._0_4_ = fVar191 * auVar83._16_4_;
        auVar130._4_4_ = fVar191 * auVar83._20_4_;
        auVar130._8_4_ = fVar191 * auVar83._24_4_;
        auVar130._12_4_ = fVar191 * auVar83._28_4_;
        auVar63 = vsubps_avx((undefined1  [16])0x0,auVar130);
        auVar58 = vshufpd_avx(auVar43,auVar43,3);
        auVar60 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
        auVar48 = vsubps_avx(auVar58,auVar43);
        auVar52 = vsubps_avx(auVar60,(undefined1  [16])0x0);
        auVar170._0_4_ = auVar48._0_4_ + auVar52._0_4_;
        auVar170._4_4_ = auVar48._4_4_ + auVar52._4_4_;
        auVar170._8_4_ = auVar48._8_4_ + auVar52._8_4_;
        auVar170._12_4_ = auVar48._12_4_ + auVar52._12_4_;
        auVar48 = vshufps_avx(auVar43,auVar43,0xb1);
        auVar52 = vshufps_avx(auVar152,auVar152,0xb1);
        auVar53 = vshufps_avx(auVar63,auVar63,0xb1);
        auVar54 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
        auVar223._4_4_ = auVar170._0_4_;
        auVar223._0_4_ = auVar170._0_4_;
        auVar223._8_4_ = auVar170._0_4_;
        auVar223._12_4_ = auVar170._0_4_;
        auVar61 = vshufps_avx(auVar170,auVar170,0x55);
        fVar191 = auVar61._0_4_;
        auVar186._0_4_ = auVar48._0_4_ * fVar191;
        fVar202 = auVar61._4_4_;
        auVar186._4_4_ = auVar48._4_4_ * fVar202;
        fVar203 = auVar61._8_4_;
        auVar186._8_4_ = auVar48._8_4_ * fVar203;
        fVar204 = auVar61._12_4_;
        auVar186._12_4_ = auVar48._12_4_ * fVar204;
        auVar194._0_4_ = auVar52._0_4_ * fVar191;
        auVar194._4_4_ = auVar52._4_4_ * fVar202;
        auVar194._8_4_ = auVar52._8_4_ * fVar203;
        auVar194._12_4_ = auVar52._12_4_ * fVar204;
        auVar209._0_4_ = auVar53._0_4_ * fVar191;
        auVar209._4_4_ = auVar53._4_4_ * fVar202;
        auVar209._8_4_ = auVar53._8_4_ * fVar203;
        auVar209._12_4_ = auVar53._12_4_ * fVar204;
        auVar171._0_4_ = auVar54._0_4_ * fVar191;
        auVar171._4_4_ = auVar54._4_4_ * fVar202;
        auVar171._8_4_ = auVar54._8_4_ * fVar203;
        auVar171._12_4_ = auVar54._12_4_ * fVar204;
        auVar48 = vfmadd231ps_fma(auVar186,auVar223,auVar43);
        auVar52 = vfmadd231ps_fma(auVar194,auVar223,auVar152);
        auVar64 = vfmadd231ps_fma(auVar209,auVar223,auVar63);
        auVar42 = vfmadd231ps_fma(auVar171,(undefined1  [16])0x0,auVar223);
        auVar61 = vshufpd_avx(auVar48,auVar48,1);
        auVar62 = vshufpd_avx(auVar52,auVar52,1);
        auVar44 = vshufpd_avx512vl(auVar64,auVar64,1);
        auVar45 = vshufpd_avx512vl(auVar42,auVar42,1);
        auVar53 = vminss_avx(auVar48,auVar52);
        auVar48 = vmaxss_avx(auVar52,auVar48);
        auVar54 = vminss_avx(auVar64,auVar42);
        auVar52 = vmaxss_avx(auVar42,auVar64);
        auVar53 = vminss_avx(auVar53,auVar54);
        auVar48 = vmaxss_avx(auVar52,auVar48);
        auVar54 = vminss_avx(auVar61,auVar62);
        auVar52 = vmaxss_avx(auVar62,auVar61);
        auVar61 = vminss_avx512f(auVar44,auVar45);
        auVar62 = vmaxss_avx512f(auVar45,auVar44);
        auVar52 = vmaxss_avx(auVar62,auVar52);
        auVar54 = vminss_avx512f(auVar54,auVar61);
        fVar202 = auVar52._0_4_;
        fVar191 = auVar48._0_4_;
        if (auVar53._0_4_ < 0.0001) {
          bVar39 = fVar202 == -0.0001;
          bVar36 = NAN(fVar202);
          if (fVar202 <= -0.0001) goto LAB_01b0f56e;
          break;
        }
LAB_01b0f56e:
        vucomiss_avx512f(auVar54);
        bVar39 = fVar202 <= -0.0001;
        bVar37 = -0.0001 < fVar191;
        bVar36 = bVar39;
        if (!bVar39) break;
        uVar14 = vcmpps_avx512vl(auVar53,SUB6416(ZEXT464(0x38d1b717),0),5);
        uVar15 = vcmpps_avx512vl(auVar54,SUB6416(ZEXT464(0x38d1b717),0),5);
        bVar26 = (byte)uVar14 & (byte)uVar15 & 1;
        bVar39 = bVar37 && bVar26 == 0;
        bVar36 = bVar37 && bVar26 == 0;
      } while (!bVar37 || bVar26 != 0);
      vcmpss_avx512f(auVar53,auVar41,1);
      auVar64 = auVar242._0_16_;
      uVar14 = vcmpss_avx512f(auVar48,auVar41,1);
      bVar37 = (bool)((byte)uVar14 & 1);
      auVar71._0_16_ = auVar64;
      iVar104 = auVar242._0_4_;
      auVar93._4_28_ = auVar71._4_28_;
      auVar93._0_4_ = (float)((uint)bVar37 * -0x40800000 + (uint)!bVar37 * iVar104);
      vucomiss_avx512f(auVar93._0_16_);
      bVar36 = (bool)(!bVar39 | bVar36);
      bVar37 = bVar36 == false;
      auVar95._16_16_ = auVar71._16_16_;
      auVar95._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
      auVar94._4_28_ = auVar95._4_28_;
      auVar94._0_4_ = (uint)bVar36 * auVar233._0_4_ + (uint)!bVar36 * 0x7f800000;
      auVar62 = auVar94._0_16_;
      auVar97._16_16_ = auVar71._16_16_;
      auVar97._0_16_ = SUB6416(ZEXT464(0xff800000),0);
      auVar96._4_28_ = auVar97._4_28_;
      auVar96._0_4_ = (uint)bVar36 * auVar233._0_4_ + (uint)!bVar36 * -0x800000;
      auVar61 = auVar96._0_16_;
      uVar14 = vcmpss_avx512f(auVar54,auVar41,1);
      bVar39 = (bool)((byte)uVar14 & 1);
      auVar99._16_16_ = auVar71._16_16_;
      auVar99._0_16_ = auVar64;
      auVar98._4_28_ = auVar99._4_28_;
      auVar98._0_4_ = (float)((uint)bVar39 * -0x40800000 + (uint)!bVar39 * iVar104);
      vucomiss_avx512f(auVar98._0_16_);
      if ((bVar36) || (bVar37)) {
        auVar54 = vucomiss_avx512f(auVar53);
        if ((bVar36) || (bVar37)) {
          auVar42 = vxorps_avx512vl(auVar53,auVar234._0_16_);
          auVar53 = vsubss_avx512f(auVar54,auVar53);
          auVar53 = vdivss_avx512f(auVar42,auVar53);
          auVar54 = vsubss_avx512f(auVar64,auVar53);
          auVar53 = vfmadd213ss_avx512f(auVar54,auVar41,auVar53);
          auVar54 = auVar53;
        }
        else {
          auVar54 = vxorps_avx512vl(auVar54,auVar54);
          vucomiss_avx512f(auVar54);
          if ((bVar36) || (auVar53 = auVar64, bVar37)) {
            auVar53 = SUB6416(ZEXT464(0xff800000),0);
            auVar54 = ZEXT416(0x7f800000);
          }
        }
        auVar62 = vminss_avx512f(auVar62,auVar54);
        auVar61 = vmaxss_avx(auVar53,auVar61);
      }
      uVar14 = vcmpss_avx512f(auVar52,auVar41,1);
      bVar39 = (bool)((byte)uVar14 & 1);
      fVar203 = (float)((uint)bVar39 * -0x40800000 + (uint)!bVar39 * iVar104);
      if ((auVar93._0_4_ != fVar203) || (NAN(auVar93._0_4_) || NAN(fVar203))) {
        if ((fVar202 != fVar191) || (NAN(fVar202) || NAN(fVar191))) {
          auVar48 = vxorps_avx512vl(auVar48,auVar234._0_16_);
          auVar172._0_4_ = auVar48._0_4_ / (fVar202 - fVar191);
          auVar172._4_12_ = auVar48._4_12_;
          auVar48 = vsubss_avx512f(auVar64,auVar172);
          auVar48 = vfmadd213ss_avx512f(auVar48,auVar41,auVar172);
          auVar52 = auVar48;
        }
        else if ((fVar191 != 0.0) ||
                (auVar48 = auVar64, auVar52 = SUB6416(ZEXT864(0),0) << 0x20, NAN(fVar191))) {
          auVar48 = SUB6416(ZEXT464(0xff800000),0);
          auVar52 = SUB6416(ZEXT464(0x7f800000),0);
        }
        auVar62 = vminss_avx(auVar62,auVar52);
        auVar61 = vmaxss_avx(auVar48,auVar61);
      }
      bVar39 = auVar98._0_4_ != fVar203;
      auVar48 = vminss_avx512f(auVar62,auVar64);
      auVar101._16_16_ = auVar71._16_16_;
      auVar101._0_16_ = auVar62;
      auVar100._4_28_ = auVar101._4_28_;
      auVar100._0_4_ = (uint)bVar39 * auVar48._0_4_ + (uint)!bVar39 * auVar62._0_4_;
      auVar48 = vmaxss_avx512f(auVar64,auVar61);
      auVar103._16_16_ = auVar71._16_16_;
      auVar103._0_16_ = auVar61;
      auVar102._4_28_ = auVar103._4_28_;
      auVar102._0_4_ = (uint)bVar39 * auVar48._0_4_ + (uint)!bVar39 * auVar61._0_4_;
      auVar48 = vmaxss_avx512f(auVar41,auVar100._0_16_);
      auVar52 = vminss_avx512f(auVar102._0_16_,auVar64);
    } while (auVar52._0_4_ < auVar48._0_4_);
    auVar54 = vmaxss_avx512f(auVar41,ZEXT416((uint)(auVar48._0_4_ + -0.1)));
    auVar42 = vminss_avx512f(ZEXT416((uint)(auVar52._0_4_ + 0.1)),auVar64);
    auVar119._0_8_ = auVar43._0_8_;
    auVar119._8_8_ = auVar119._0_8_;
    auVar195._8_8_ = auVar152._0_8_;
    auVar195._0_8_ = auVar152._0_8_;
    auVar210._8_8_ = auVar63._0_8_;
    auVar210._0_8_ = auVar63._0_8_;
    auVar48 = vshufpd_avx(auVar152,auVar152,3);
    auVar52 = vshufpd_avx(auVar63,auVar63,3);
    auVar53 = vshufps_avx(auVar54,auVar42,0);
    auVar62 = vsubps_avx512vl(auVar55,auVar53);
    fVar191 = auVar53._0_4_;
    auVar145._0_4_ = fVar191 * auVar58._0_4_;
    fVar202 = auVar53._4_4_;
    auVar145._4_4_ = fVar202 * auVar58._4_4_;
    fVar203 = auVar53._8_4_;
    auVar145._8_4_ = fVar203 * auVar58._8_4_;
    fVar204 = auVar53._12_4_;
    auVar145._12_4_ = fVar204 * auVar58._12_4_;
    auVar153._0_4_ = fVar191 * auVar48._0_4_;
    auVar153._4_4_ = fVar202 * auVar48._4_4_;
    auVar153._8_4_ = fVar203 * auVar48._8_4_;
    auVar153._12_4_ = fVar204 * auVar48._12_4_;
    auVar228._0_4_ = auVar52._0_4_ * fVar191;
    auVar228._4_4_ = auVar52._4_4_ * fVar202;
    auVar228._8_4_ = auVar52._8_4_ * fVar203;
    auVar228._12_4_ = auVar52._12_4_ * fVar204;
    auVar131._0_4_ = fVar191 * auVar60._0_4_;
    auVar131._4_4_ = fVar202 * auVar60._4_4_;
    auVar131._8_4_ = fVar203 * auVar60._8_4_;
    auVar131._12_4_ = fVar204 * auVar60._12_4_;
    auVar58 = vfmadd231ps_fma(auVar145,auVar62,auVar119);
    auVar60 = vfmadd231ps_fma(auVar153,auVar62,auVar195);
    auVar61 = vfmadd231ps_fma(auVar228,auVar62,auVar210);
    auVar62 = vfmadd231ps_fma(auVar131,auVar62,ZEXT816(0));
    auVar52 = vsubss_avx512f(auVar64,auVar54);
    auVar48 = vmovshdup_avx(auVar59);
    auVar43 = vfmadd231ss_fma(ZEXT416((uint)(auVar48._0_4_ * auVar54._0_4_)),auVar59,auVar52);
    auVar52 = vsubss_avx512f(auVar64,auVar42);
    auVar44 = vfmadd231ss_fma(ZEXT416((uint)(auVar48._0_4_ * auVar42._0_4_)),auVar59,auVar52);
    auVar59 = vdivss_avx512f(auVar64,ZEXT416((uint)fVar207));
    auVar48 = vsubps_avx(auVar60,auVar58);
    auVar53 = vmulps_avx512vl(auVar48,auVar49);
    auVar48 = vsubps_avx(auVar61,auVar60);
    auVar54 = vmulps_avx512vl(auVar48,auVar49);
    auVar48 = vsubps_avx(auVar62,auVar61);
    auVar48 = vmulps_avx512vl(auVar48,auVar49);
    auVar52 = vminps_avx(auVar54,auVar48);
    auVar48 = vmaxps_avx(auVar54,auVar48);
    auVar52 = vminps_avx(auVar53,auVar52);
    auVar48 = vmaxps_avx(auVar53,auVar48);
    auVar53 = vshufpd_avx(auVar52,auVar52,3);
    auVar54 = vshufpd_avx(auVar48,auVar48,3);
    auVar52 = vminps_avx(auVar52,auVar53);
    auVar48 = vmaxps_avx(auVar48,auVar54);
    fVar207 = auVar59._0_4_;
    auVar173._0_4_ = auVar52._0_4_ * fVar207;
    auVar173._4_4_ = auVar52._4_4_ * fVar207;
    auVar173._8_4_ = auVar52._8_4_ * fVar207;
    auVar173._12_4_ = auVar52._12_4_ * fVar207;
    auVar161._0_4_ = fVar207 * auVar48._0_4_;
    auVar161._4_4_ = fVar207 * auVar48._4_4_;
    auVar161._8_4_ = fVar207 * auVar48._8_4_;
    auVar161._12_4_ = fVar207 * auVar48._12_4_;
    auVar63 = vdivss_avx512f(auVar64,ZEXT416((uint)(auVar44._0_4_ - auVar43._0_4_)));
    auVar48 = vshufpd_avx(auVar58,auVar58,3);
    auVar52 = vshufpd_avx(auVar60,auVar60,3);
    auVar53 = vshufpd_avx(auVar61,auVar61,3);
    auVar54 = vshufpd_avx(auVar62,auVar62,3);
    auVar48 = vsubps_avx(auVar48,auVar58);
    auVar58 = vsubps_avx(auVar52,auVar60);
    auVar59 = vsubps_avx(auVar53,auVar61);
    auVar54 = vsubps_avx(auVar54,auVar62);
    auVar52 = vminps_avx(auVar48,auVar58);
    auVar48 = vmaxps_avx(auVar48,auVar58);
    auVar53 = vminps_avx(auVar59,auVar54);
    auVar53 = vminps_avx(auVar52,auVar53);
    auVar52 = vmaxps_avx(auVar59,auVar54);
    auVar48 = vmaxps_avx(auVar48,auVar52);
    fVar207 = auVar63._0_4_;
    auVar211._0_4_ = fVar207 * auVar53._0_4_;
    auVar211._4_4_ = fVar207 * auVar53._4_4_;
    auVar211._8_4_ = fVar207 * auVar53._8_4_;
    auVar211._12_4_ = fVar207 * auVar53._12_4_;
    auVar196._0_4_ = fVar207 * auVar48._0_4_;
    auVar196._4_4_ = fVar207 * auVar48._4_4_;
    auVar196._8_4_ = fVar207 * auVar48._8_4_;
    auVar196._12_4_ = fVar207 * auVar48._12_4_;
    auVar54 = vinsertps_avx(auVar40,auVar43,0x10);
    auVar45 = vpermt2ps_avx512vl(auVar40,_DAT_01fb9f90,auVar44);
    auVar110._0_4_ = auVar54._0_4_ + auVar45._0_4_;
    auVar110._4_4_ = auVar54._4_4_ + auVar45._4_4_;
    auVar110._8_4_ = auVar54._8_4_ + auVar45._8_4_;
    auVar110._12_4_ = auVar54._12_4_ + auVar45._12_4_;
    auVar18._8_4_ = 0x3f000000;
    auVar18._0_8_ = 0x3f0000003f000000;
    auVar18._12_4_ = 0x3f000000;
    auVar62 = vmulps_avx512vl(auVar110,auVar18);
    auVar52 = vshufps_avx(auVar62,auVar62,0x54);
    uVar105 = auVar62._0_4_;
    auVar112._4_4_ = uVar105;
    auVar112._0_4_ = uVar105;
    auVar112._8_4_ = uVar105;
    auVar112._12_4_ = uVar105;
    auVar53 = vfmadd213ps_fma(auVar241._0_16_,auVar112,local_268);
    auVar58 = vfmadd213ps_fma(local_e8,auVar112,local_278);
    auVar59 = vfmadd213ps_fma(local_f8,auVar112,local_288);
    auVar48 = vsubps_avx(auVar58,auVar53);
    auVar53 = vfmadd213ps_fma(auVar48,auVar112,auVar53);
    auVar48 = vsubps_avx(auVar59,auVar58);
    auVar48 = vfmadd213ps_fma(auVar48,auVar112,auVar58);
    auVar48 = vsubps_avx(auVar48,auVar53);
    auVar53 = vfmadd231ps_fma(auVar53,auVar48,auVar112);
    auVar60 = vmulps_avx512vl(auVar48,auVar49);
    auVar218._8_8_ = auVar53._0_8_;
    auVar218._0_8_ = auVar53._0_8_;
    auVar48 = vshufpd_avx(auVar53,auVar53,3);
    auVar53 = vshufps_avx(auVar62,auVar62,0x55);
    auVar58 = vsubps_avx(auVar48,auVar218);
    auVar59 = vfmadd231ps_fma(auVar218,auVar53,auVar58);
    auVar229._8_8_ = auVar60._0_8_;
    auVar229._0_8_ = auVar60._0_8_;
    auVar48 = vshufpd_avx(auVar60,auVar60,3);
    auVar48 = vsubps_avx512vl(auVar48,auVar229);
    auVar48 = vfmadd213ps_avx512vl(auVar48,auVar53,auVar229);
    auVar113._0_8_ = auVar58._0_8_ ^ 0x8000000080000000;
    auVar113._8_4_ = auVar58._8_4_ ^ 0x80000000;
    auVar113._12_4_ = auVar58._12_4_ ^ 0x80000000;
    auVar53 = vmovshdup_avx512vl(auVar48);
    auVar230._0_8_ = auVar53._0_8_ ^ 0x8000000080000000;
    auVar230._8_4_ = auVar53._8_4_ ^ 0x80000000;
    auVar230._12_4_ = auVar53._12_4_ ^ 0x80000000;
    auVar60 = vmovshdup_avx512vl(auVar58);
    auVar61 = vpermt2ps_avx512vl(auVar230,ZEXT416(5),auVar58);
    auVar53 = vfmsub231ss_avx512f(ZEXT416((uint)(auVar53._0_4_ * auVar58._0_4_)),auVar48,auVar60);
    auVar58 = vpermt2ps_avx512vl(auVar48,SUB6416(ZEXT464(4),0),auVar113);
    auVar132._0_4_ = auVar53._0_4_;
    auVar132._4_4_ = auVar132._0_4_;
    auVar132._8_4_ = auVar132._0_4_;
    auVar132._12_4_ = auVar132._0_4_;
    auVar48 = vdivps_avx(auVar61,auVar132);
    auVar46 = vdivps_avx512vl(auVar58,auVar132);
    fVar207 = auVar59._0_4_;
    auVar53 = vshufps_avx(auVar59,auVar59,0x55);
    auVar219._0_4_ = fVar207 * auVar48._0_4_ + auVar53._0_4_ * auVar46._0_4_;
    auVar219._4_4_ = fVar207 * auVar48._4_4_ + auVar53._4_4_ * auVar46._4_4_;
    auVar219._8_4_ = fVar207 * auVar48._8_4_ + auVar53._8_4_ * auVar46._8_4_;
    auVar219._12_4_ = fVar207 * auVar48._12_4_ + auVar53._12_4_ * auVar46._12_4_;
    auVar63 = vsubps_avx(auVar52,auVar219);
    auVar53 = vmovshdup_avx(auVar48);
    auVar52 = vinsertps_avx(auVar173,auVar211,0x1c);
    auVar231._0_4_ = auVar53._0_4_ * auVar52._0_4_;
    auVar231._4_4_ = auVar53._4_4_ * auVar52._4_4_;
    auVar231._8_4_ = auVar53._8_4_ * auVar52._8_4_;
    auVar231._12_4_ = auVar53._12_4_ * auVar52._12_4_;
    auVar42 = vinsertps_avx512f(auVar161,auVar196,0x1c);
    auVar53 = vmulps_avx512vl(auVar53,auVar42);
    auVar61 = vminps_avx512vl(auVar231,auVar53);
    auVar59 = vmaxps_avx(auVar53,auVar231);
    auVar60 = vmovshdup_avx(auVar46);
    auVar53 = vinsertps_avx(auVar211,auVar173,0x4c);
    auVar212._0_4_ = auVar60._0_4_ * auVar53._0_4_;
    auVar212._4_4_ = auVar60._4_4_ * auVar53._4_4_;
    auVar212._8_4_ = auVar60._8_4_ * auVar53._8_4_;
    auVar212._12_4_ = auVar60._12_4_ * auVar53._12_4_;
    auVar58 = vinsertps_avx(auVar196,auVar161,0x4c);
    auVar197._0_4_ = auVar60._0_4_ * auVar58._0_4_;
    auVar197._4_4_ = auVar60._4_4_ * auVar58._4_4_;
    auVar197._8_4_ = auVar60._8_4_ * auVar58._8_4_;
    auVar197._12_4_ = auVar60._12_4_ * auVar58._12_4_;
    auVar60 = vminps_avx(auVar212,auVar197);
    auVar61 = vaddps_avx512vl(auVar61,auVar60);
    auVar60 = vmaxps_avx(auVar197,auVar212);
    auVar198._0_4_ = auVar59._0_4_ + auVar60._0_4_;
    auVar198._4_4_ = auVar59._4_4_ + auVar60._4_4_;
    auVar198._8_4_ = auVar59._8_4_ + auVar60._8_4_;
    auVar198._12_4_ = auVar59._12_4_ + auVar60._12_4_;
    auVar213._8_8_ = 0x3f80000000000000;
    auVar213._0_8_ = 0x3f80000000000000;
    auVar59 = vsubps_avx(auVar213,auVar198);
    auVar60 = vsubps_avx(auVar213,auVar61);
    auVar61 = vsubps_avx(auVar54,auVar62);
    auVar62 = vsubps_avx(auVar45,auVar62);
    fVar204 = auVar61._0_4_;
    auVar232._0_4_ = fVar204 * auVar59._0_4_;
    fVar205 = auVar61._4_4_;
    auVar232._4_4_ = fVar205 * auVar59._4_4_;
    fVar206 = auVar61._8_4_;
    auVar232._8_4_ = fVar206 * auVar59._8_4_;
    fVar149 = auVar61._12_4_;
    auVar232._12_4_ = fVar149 * auVar59._12_4_;
    auVar47 = vbroadcastss_avx512vl(auVar48);
    auVar52 = vmulps_avx512vl(auVar47,auVar52);
    auVar42 = vmulps_avx512vl(auVar47,auVar42);
    auVar47 = vminps_avx512vl(auVar52,auVar42);
    auVar42 = vmaxps_avx512vl(auVar42,auVar52);
    auVar52 = vbroadcastss_avx512vl(auVar46);
    auVar53 = vmulps_avx512vl(auVar52,auVar53);
    auVar52 = vmulps_avx512vl(auVar52,auVar58);
    auVar58 = vminps_avx512vl(auVar53,auVar52);
    auVar58 = vaddps_avx512vl(auVar47,auVar58);
    auVar61 = vmulps_avx512vl(auVar61,auVar60);
    fVar207 = auVar62._0_4_;
    auVar199._0_4_ = fVar207 * auVar59._0_4_;
    fVar191 = auVar62._4_4_;
    auVar199._4_4_ = fVar191 * auVar59._4_4_;
    fVar202 = auVar62._8_4_;
    auVar199._8_4_ = fVar202 * auVar59._8_4_;
    fVar203 = auVar62._12_4_;
    auVar199._12_4_ = fVar203 * auVar59._12_4_;
    auVar214._0_4_ = fVar207 * auVar60._0_4_;
    auVar214._4_4_ = fVar191 * auVar60._4_4_;
    auVar214._8_4_ = fVar202 * auVar60._8_4_;
    auVar214._12_4_ = fVar203 * auVar60._12_4_;
    auVar52 = vmaxps_avx(auVar52,auVar53);
    auVar162._0_4_ = auVar42._0_4_ + auVar52._0_4_;
    auVar162._4_4_ = auVar42._4_4_ + auVar52._4_4_;
    auVar162._8_4_ = auVar42._8_4_ + auVar52._8_4_;
    auVar162._12_4_ = auVar42._12_4_ + auVar52._12_4_;
    auVar174._8_8_ = 0x3f800000;
    auVar174._0_8_ = 0x3f800000;
    auVar52 = vsubps_avx(auVar174,auVar162);
    auVar53 = vsubps_avx512vl(auVar174,auVar58);
    auVar224._0_4_ = fVar204 * auVar52._0_4_;
    auVar224._4_4_ = fVar205 * auVar52._4_4_;
    auVar224._8_4_ = fVar206 * auVar52._8_4_;
    auVar224._12_4_ = fVar149 * auVar52._12_4_;
    auVar220._0_4_ = fVar204 * auVar53._0_4_;
    auVar220._4_4_ = fVar205 * auVar53._4_4_;
    auVar220._8_4_ = fVar206 * auVar53._8_4_;
    auVar220._12_4_ = fVar149 * auVar53._12_4_;
    auVar163._0_4_ = fVar207 * auVar52._0_4_;
    auVar163._4_4_ = fVar191 * auVar52._4_4_;
    auVar163._8_4_ = fVar202 * auVar52._8_4_;
    auVar163._12_4_ = fVar203 * auVar52._12_4_;
    auVar175._0_4_ = fVar207 * auVar53._0_4_;
    auVar175._4_4_ = fVar191 * auVar53._4_4_;
    auVar175._8_4_ = fVar202 * auVar53._8_4_;
    auVar175._12_4_ = fVar203 * auVar53._12_4_;
    auVar52 = vminps_avx(auVar224,auVar220);
    auVar53 = vminps_avx512vl(auVar163,auVar175);
    auVar58 = vminps_avx512vl(auVar52,auVar53);
    auVar52 = vmaxps_avx(auVar220,auVar224);
    auVar53 = vmaxps_avx(auVar175,auVar163);
    auVar53 = vmaxps_avx(auVar53,auVar52);
    auVar59 = vminps_avx512vl(auVar232,auVar61);
    auVar52 = vminps_avx(auVar199,auVar214);
    auVar52 = vminps_avx(auVar59,auVar52);
    auVar52 = vhaddps_avx(auVar58,auVar52);
    auVar59 = vmaxps_avx512vl(auVar61,auVar232);
    auVar58 = vmaxps_avx(auVar214,auVar199);
    auVar58 = vmaxps_avx(auVar58,auVar59);
    auVar53 = vhaddps_avx(auVar53,auVar58);
    auVar52 = vshufps_avx(auVar52,auVar52,0xe8);
    auVar53 = vshufps_avx(auVar53,auVar53,0xe8);
    auVar164._0_4_ = auVar52._0_4_ + auVar63._0_4_;
    auVar164._4_4_ = auVar52._4_4_ + auVar63._4_4_;
    auVar164._8_4_ = auVar52._8_4_ + auVar63._8_4_;
    auVar164._12_4_ = auVar52._12_4_ + auVar63._12_4_;
    auVar176._0_4_ = auVar53._0_4_ + auVar63._0_4_;
    auVar176._4_4_ = auVar53._4_4_ + auVar63._4_4_;
    auVar176._8_4_ = auVar53._8_4_ + auVar63._8_4_;
    auVar176._12_4_ = auVar53._12_4_ + auVar63._12_4_;
    auVar52 = vmaxps_avx(auVar54,auVar164);
    auVar53 = vminps_avx(auVar176,auVar45);
    uVar2 = vcmpps_avx512vl(auVar53,auVar52,1);
  } while ((uVar2 & 3) != 0);
  uVar2 = vcmpps_avx512vl(auVar176,auVar45,1);
  uVar14 = vcmpps_avx512vl(auVar40,auVar164,1);
  if (((ushort)uVar14 & (ushort)uVar2 & 1) == 0) {
    bVar26 = 0;
  }
  else {
    auVar52 = vmovshdup_avx(auVar164);
    bVar26 = auVar43._0_4_ < auVar52._0_4_ & (byte)(uVar2 >> 1) & 0x7f;
  }
  if (((3 < (uint)uVar28 || uVar7 != 0 && !bVar38) | bVar26) != 1) goto LAB_01b101a5;
  lVar30 = 0xc9;
  do {
    lVar30 = lVar30 + -1;
    if (lVar30 == 0) goto LAB_01b0f343;
    auVar40 = vsubss_avx512f(auVar64,auVar63);
    fVar202 = auVar40._0_4_;
    fVar207 = fVar202 * fVar202 * fVar202;
    auVar40 = vmulss_avx512f(auVar63,ZEXT416(0x40400000));
    fVar191 = auVar40._0_4_ * fVar202 * fVar202;
    fVar203 = auVar63._0_4_;
    auVar40 = vmulss_avx512f(ZEXT416((uint)(fVar203 * fVar203)),ZEXT416(0x40400000));
    fVar202 = fVar202 * auVar40._0_4_;
    auVar125._4_4_ = fVar207;
    auVar125._0_4_ = fVar207;
    auVar125._8_4_ = fVar207;
    auVar125._12_4_ = fVar207;
    auVar120._4_4_ = fVar191;
    auVar120._0_4_ = fVar191;
    auVar120._8_4_ = fVar191;
    auVar120._12_4_ = fVar191;
    auVar107._4_4_ = fVar202;
    auVar107._0_4_ = fVar202;
    auVar107._8_4_ = fVar202;
    auVar107._12_4_ = fVar202;
    fVar203 = fVar203 * fVar203 * fVar203;
    auVar146._0_4_ = (float)local_108._0_4_ * fVar203;
    auVar146._4_4_ = (float)local_108._4_4_ * fVar203;
    auVar146._8_4_ = fStack_100 * fVar203;
    auVar146._12_4_ = fStack_fc * fVar203;
    auVar40 = vfmadd231ps_fma(auVar146,local_288,auVar107);
    auVar40 = vfmadd231ps_fma(auVar40,local_278,auVar120);
    auVar40 = vfmadd231ps_fma(auVar40,local_268,auVar125);
    auVar108._8_8_ = auVar40._0_8_;
    auVar108._0_8_ = auVar40._0_8_;
    auVar40 = vshufpd_avx(auVar40,auVar40,3);
    auVar52 = vshufps_avx(auVar63,auVar63,0x55);
    auVar40 = vsubps_avx(auVar40,auVar108);
    auVar52 = vfmadd213ps_fma(auVar40,auVar52,auVar108);
    fVar207 = auVar52._0_4_;
    auVar40 = vshufps_avx(auVar52,auVar52,0x55);
    auVar109._0_4_ = auVar48._0_4_ * fVar207 + auVar46._0_4_ * auVar40._0_4_;
    auVar109._4_4_ = auVar48._4_4_ * fVar207 + auVar46._4_4_ * auVar40._4_4_;
    auVar109._8_4_ = auVar48._8_4_ * fVar207 + auVar46._8_4_ * auVar40._8_4_;
    auVar109._12_4_ = auVar48._12_4_ * fVar207 + auVar46._12_4_ * auVar40._12_4_;
    auVar63 = vsubps_avx(auVar63,auVar109);
    auVar40 = vandps_avx512vl(auVar52,auVar243._0_16_);
    auVar52 = vprolq_avx512vl(auVar40,0x20);
    auVar40 = vmaxss_avx(auVar52,auVar40);
    bVar38 = (float)local_118._0_4_ < auVar40._0_4_;
  } while ((float)local_118._0_4_ <= auVar40._0_4_);
  auVar40 = vucomiss_avx512f(auVar41);
  if (bVar38) goto LAB_01b0f343;
  auVar48 = vucomiss_avx512f(auVar40);
  auVar242 = ZEXT1664(auVar48);
  if (bVar38) goto LAB_01b0f343;
  vmovshdup_avx(auVar40);
  auVar48 = vucomiss_avx512f(auVar41);
  if (bVar38) goto LAB_01b0f343;
  auVar52 = vucomiss_avx512f(auVar48);
  auVar242 = ZEXT1664(auVar52);
  if (bVar38) goto LAB_01b0f343;
  auVar53 = vinsertps_avx(ZEXT416((uint)(pre->ray_space).vx.field_0.m128[2]),
                          ZEXT416((uint)(pre->ray_space).vy.field_0.m128[2]),0x1c);
  auVar63 = vinsertps_avx(auVar53,ZEXT416((uint)(pre->ray_space).vz.field_0.m128[2]),0x28);
  aVar3 = (ray->super_RayK<1>).org.field_0;
  auVar53 = vsubps_avx(local_1a8,(undefined1  [16])aVar3);
  auVar53 = vdpps_avx(auVar53,auVar63,0x7f);
  auVar54 = vsubps_avx(local_1b8,(undefined1  [16])aVar3);
  auVar54 = vdpps_avx(auVar54,auVar63,0x7f);
  auVar58 = vsubps_avx(local_1c8,(undefined1  [16])aVar3);
  auVar58 = vdpps_avx(auVar58,auVar63,0x7f);
  auVar59 = vsubps_avx(local_1d8,(undefined1  [16])aVar3);
  auVar59 = vdpps_avx(auVar59,auVar63,0x7f);
  auVar60 = vsubps_avx(_local_1e8,(undefined1  [16])aVar3);
  auVar60 = vdpps_avx(auVar60,auVar63,0x7f);
  auVar61 = vsubps_avx(_local_1f8,(undefined1  [16])aVar3);
  auVar61 = vdpps_avx(auVar61,auVar63,0x7f);
  auVar62 = vsubps_avx(_local_208,(undefined1  [16])aVar3);
  auVar62 = vdpps_avx(auVar62,auVar63,0x7f);
  auVar64 = vsubps_avx(_local_218,(undefined1  [16])aVar3);
  auVar63 = vdpps_avx(auVar64,auVar63,0x7f);
  auVar64 = vsubss_avx512f(auVar52,auVar48);
  fVar207 = auVar48._0_4_;
  auVar48 = vfmadd231ss_fma(ZEXT416((uint)(auVar60._0_4_ * fVar207)),auVar64,auVar53);
  auVar53 = vfmadd231ss_fma(ZEXT416((uint)(auVar61._0_4_ * fVar207)),auVar64,auVar54);
  auVar54 = vfmadd231ss_fma(ZEXT416((uint)(auVar62._0_4_ * fVar207)),auVar64,auVar58);
  auVar58 = vfmadd231ss_fma(ZEXT416((uint)(fVar207 * auVar63._0_4_)),auVar64,auVar59);
  auVar52 = vsubss_avx512f(auVar52,auVar40);
  auVar147._0_4_ = auVar52._0_4_;
  fVar191 = auVar147._0_4_ * auVar147._0_4_ * auVar147._0_4_;
  auVar52 = vmulss_avx512f(auVar40,ZEXT416(0x40400000));
  fVar202 = auVar52._0_4_ * auVar147._0_4_ * auVar147._0_4_;
  fVar207 = auVar40._0_4_;
  auVar133._0_4_ = fVar207 * fVar207;
  auVar133._4_4_ = auVar40._4_4_ * auVar40._4_4_;
  auVar133._8_4_ = auVar40._8_4_ * auVar40._8_4_;
  auVar133._12_4_ = auVar40._12_4_ * auVar40._12_4_;
  auVar52 = vmulss_avx512f(auVar133,ZEXT416(0x40400000));
  fVar203 = auVar147._0_4_ * auVar52._0_4_;
  fVar205 = fVar207 * auVar133._0_4_;
  auVar52 = vfmadd231ss_fma(ZEXT416((uint)(fVar205 * auVar58._0_4_)),ZEXT416((uint)fVar203),auVar54)
  ;
  auVar52 = vfmadd231ss_fma(auVar52,ZEXT416((uint)fVar202),auVar53);
  auVar48 = vfmadd231ss_fma(auVar52,ZEXT416((uint)fVar191),auVar48);
  fVar204 = auVar48._0_4_;
  if ((fVar204 < (ray->super_RayK<1>).org.field_0.m128[3]) ||
     (fVar206 = (ray->super_RayK<1>).tfar, fVar206 < fVar204)) goto LAB_01b0f343;
  auVar48 = vshufps_avx(auVar40,auVar40,0x55);
  auVar53 = vsubps_avx512vl(auVar55,auVar48);
  fVar149 = auVar48._0_4_;
  auVar177._0_4_ = fVar149 * (float)local_1e8._0_4_;
  fVar166 = auVar48._4_4_;
  auVar177._4_4_ = fVar166 * (float)local_1e8._4_4_;
  fVar179 = auVar48._8_4_;
  auVar177._8_4_ = fVar179 * fStack_1e0;
  fVar180 = auVar48._12_4_;
  auVar177._12_4_ = fVar180 * fStack_1dc;
  auVar187._0_4_ = fVar149 * (float)local_1f8._0_4_;
  auVar187._4_4_ = fVar166 * (float)local_1f8._4_4_;
  auVar187._8_4_ = fVar179 * fStack_1f0;
  auVar187._12_4_ = fVar180 * fStack_1ec;
  auVar200._0_4_ = fVar149 * (float)local_208._0_4_;
  auVar200._4_4_ = fVar166 * (float)local_208._4_4_;
  auVar200._8_4_ = fVar179 * fStack_200;
  auVar200._12_4_ = fVar180 * fStack_1fc;
  auVar154._0_4_ = fVar149 * (float)local_218._0_4_;
  auVar154._4_4_ = fVar166 * (float)local_218._4_4_;
  auVar154._8_4_ = fVar179 * fStack_210;
  auVar154._12_4_ = fVar180 * fStack_20c;
  auVar48 = vfmadd231ps_fma(auVar177,auVar53,local_1a8);
  auVar55 = vfmadd231ps_fma(auVar187,auVar53,local_1b8);
  auVar52 = vfmadd231ps_fma(auVar200,auVar53,local_1c8);
  auVar53 = vfmadd231ps_fma(auVar154,auVar53,local_1d8);
  auVar48 = vsubps_avx(auVar55,auVar48);
  auVar55 = vsubps_avx(auVar52,auVar55);
  auVar52 = vsubps_avx(auVar53,auVar52);
  auVar201._0_4_ = fVar207 * auVar55._0_4_;
  auVar201._4_4_ = fVar207 * auVar55._4_4_;
  auVar201._8_4_ = fVar207 * auVar55._8_4_;
  auVar201._12_4_ = fVar207 * auVar55._12_4_;
  auVar147._4_4_ = auVar147._0_4_;
  auVar147._8_4_ = auVar147._0_4_;
  auVar147._12_4_ = auVar147._0_4_;
  auVar48 = vfmadd231ps_fma(auVar201,auVar147,auVar48);
  auVar155._0_4_ = fVar207 * auVar52._0_4_;
  auVar155._4_4_ = fVar207 * auVar52._4_4_;
  auVar155._8_4_ = fVar207 * auVar52._8_4_;
  auVar155._12_4_ = fVar207 * auVar52._12_4_;
  auVar55 = vfmadd231ps_fma(auVar155,auVar147,auVar55);
  auVar156._0_4_ = fVar207 * auVar55._0_4_;
  auVar156._4_4_ = fVar207 * auVar55._4_4_;
  auVar156._8_4_ = fVar207 * auVar55._8_4_;
  auVar156._12_4_ = fVar207 * auVar55._12_4_;
  auVar48 = vfmadd231ps_fma(auVar156,auVar147,auVar48);
  auVar49 = vmulps_avx512vl(auVar48,auVar49);
  pGVar8 = (context->scene->geometries).items[uVar6].ptr;
  if ((pGVar8->mask & (ray->super_RayK<1>).mask) == 0) goto LAB_01b0f343;
  auVar134._0_4_ = fVar205 * (float)local_158._0_4_;
  auVar134._4_4_ = fVar205 * (float)local_158._4_4_;
  auVar134._8_4_ = fVar205 * fStack_150;
  auVar134._12_4_ = fVar205 * fStack_14c;
  auVar126._4_4_ = fVar203;
  auVar126._0_4_ = fVar203;
  auVar126._8_4_ = fVar203;
  auVar126._12_4_ = fVar203;
  auVar48 = vfmadd132ps_fma(auVar126,auVar134,local_148);
  auVar121._4_4_ = fVar202;
  auVar121._0_4_ = fVar202;
  auVar121._8_4_ = fVar202;
  auVar121._12_4_ = fVar202;
  auVar48 = vfmadd132ps_fma(auVar121,auVar48,local_138);
  auVar114._4_4_ = fVar191;
  auVar114._0_4_ = fVar191;
  auVar114._8_4_ = fVar191;
  auVar114._12_4_ = fVar191;
  auVar52 = vfmadd132ps_fma(auVar114,auVar48,local_128);
  auVar48 = vshufps_avx(auVar52,auVar52,0xc9);
  auVar55 = vshufps_avx(auVar49,auVar49,0xc9);
  auVar115._0_4_ = auVar52._0_4_ * auVar55._0_4_;
  auVar115._4_4_ = auVar52._4_4_ * auVar55._4_4_;
  auVar115._8_4_ = auVar52._8_4_ * auVar55._8_4_;
  auVar115._12_4_ = auVar52._12_4_ * auVar55._12_4_;
  auVar48 = vfmsub231ps_fma(auVar115,auVar49,auVar48);
  auVar49 = vshufps_avx(auVar48,auVar48,0xe9);
  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
     (pGVar8->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
    (ray->super_RayK<1>).tfar = fVar204;
    uVar14 = vmovlps_avx(auVar49);
    *(undefined8 *)&(ray->Ng).field_0 = uVar14;
    (ray->Ng).field_0.field_0.z = auVar48._0_4_;
    uVar14 = vmovlps_avx(auVar40);
    ray->u = (float)(int)uVar14;
    ray->v = (float)(int)((ulong)uVar14 >> 0x20);
    ray->primID = (uint)local_310;
    ray->geomID = uVar6;
    ray->instID[0] = context->user->instID[0];
    ray->instPrimID[0] = context->user->instPrimID[0];
    goto LAB_01b0f343;
  }
  local_188 = vmovlps_avx(auVar49);
  local_180 = auVar48._0_4_;
  local_17c = vmovlps_avx(auVar40);
  local_174 = (uint)local_310;
  local_170 = uVar6;
  local_16c = context->user->instID[0];
  local_168 = context->user->instPrimID[0];
  (ray->super_RayK<1>).tfar = fVar204;
  local_32c = -1;
  local_248.valid = &local_32c;
  local_248.geometryUserPtr = pGVar8->userPtr;
  local_248.context = context->user;
  local_248.ray = (RTCRayN *)ray;
  local_248.hit = (RTCHitN *)&local_188;
  local_248.N = 1;
  if (pGVar8->intersectionFilterN != (RTCFilterFunctionN)0x0) {
    local_258 = lVar34;
    (*pGVar8->intersectionFilterN)(&local_248);
    auVar240 = ZEXT3264(_DAT_01fb9fe0);
    auVar238 = ZEXT464(0x3e2aaaab);
    auVar40 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar237 = ZEXT1664(auVar40);
    auVar40 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
    auVar236 = ZEXT1664(auVar40);
    auVar83 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar235 = ZEXT3264(auVar83);
    auVar71._16_16_ = auVar83._16_16_;
    auVar241 = ZEXT1664(local_328);
    auVar40 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
    auVar234 = ZEXT1664(auVar40);
    auVar40 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
    auVar243 = ZEXT1664(auVar40);
    auVar242 = ZEXT464(0x3f800000);
    auVar40 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar239 = ZEXT1664(auVar40);
    auVar40 = vxorps_avx512vl(auVar41,auVar41);
    auVar233 = ZEXT1664(auVar40);
    lVar34 = local_258;
    if (*local_248.valid == 0) goto LAB_01b10194;
  }
  auVar40 = auVar233._0_16_;
  p_Var13 = context->args->filter;
  if ((p_Var13 != (RTCFilterFunctionN)0x0) &&
     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar8->field_8).field_0x2 & 0x40) != 0)))) {
    (*p_Var13)(&local_248);
    auVar240 = ZEXT3264(_DAT_01fb9fe0);
    auVar238 = ZEXT464(0x3e2aaaab);
    auVar41 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar237 = ZEXT1664(auVar41);
    auVar41 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
    auVar236 = ZEXT1664(auVar41);
    auVar83 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar235 = ZEXT3264(auVar83);
    auVar71._16_16_ = auVar83._16_16_;
    auVar241 = ZEXT1664(local_328);
    auVar41 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
    auVar234 = ZEXT1664(auVar41);
    auVar41 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
    auVar243 = ZEXT1664(auVar41);
    auVar242 = ZEXT464(0x3f800000);
    auVar41 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar239 = ZEXT1664(auVar41);
    auVar40 = vxorps_avx512vl(auVar40,auVar40);
    auVar233 = ZEXT1664(auVar40);
    if (*local_248.valid == 0) {
LAB_01b10194:
      auVar242 = ZEXT464(0x3f800000);
      auVar238 = ZEXT464(0x3e2aaaab);
      (ray->super_RayK<1>).tfar = fVar206;
      goto LAB_01b0f343;
    }
  }
  (((Vec3f *)((long)local_248.ray + 0x30))->field_0).components[0] = *(float *)local_248.hit;
  (((Vec3f *)((long)local_248.ray + 0x30))->field_0).field_0.y = *(float *)(local_248.hit + 4);
  (((Vec3f *)((long)local_248.ray + 0x30))->field_0).field_0.z = *(float *)(local_248.hit + 8);
  *(float *)((long)local_248.ray + 0x3c) = *(float *)(local_248.hit + 0xc);
  *(float *)((long)local_248.ray + 0x40) = *(float *)(local_248.hit + 0x10);
  *(float *)((long)local_248.ray + 0x44) = *(float *)(local_248.hit + 0x14);
  *(float *)((long)local_248.ray + 0x48) = *(float *)(local_248.hit + 0x18);
  *(float *)((long)local_248.ray + 0x4c) = *(float *)(local_248.hit + 0x1c);
  *(float *)((long)local_248.ray + 0x50) = *(float *)(local_248.hit + 0x20);
  goto LAB_01b0f343;
LAB_01b101a5:
  auVar59 = vinsertps_avx(auVar43,auVar44,0x10);
  goto LAB_01b0ee4c;
}

Assistant:

static __forceinline void intersect_n(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          const TensorLinearCubicBezierSurface3fa curve = geom->getNormalOrientedCurve<typename Intersector::SourceCurve3ff, typename Intersector::SourceCurve3fa, TensorLinearCubicBezierSurface3fa>(context, ray.org, primID,ray.time());
          Intersector().intersect(pre,ray,context,geom,primID,curve,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }